

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SWAP.cpp
# Opt level: O1

void test_qclab_qgates_SWAP<std::complex<double>>(void)

{
  _func_int **pp_Var1;
  double *pdVar2;
  double *pdVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  double dVar5;
  double dVar6;
  pointer pcVar7;
  __uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  _Var8;
  QObject<std::complex<double>_> QVar9;
  undefined1 auVar10 [8];
  int iVar11;
  undefined8 *puVar12;
  undefined8 *puVar13;
  undefined8 *puVar14;
  __uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
  _Var15;
  _Type aiVar16;
  double *pdVar17;
  _Type aiVar18;
  pointer pcVar19;
  complex<double> *__s;
  double *pdVar20;
  long lVar21;
  undefined8 *puVar22;
  ulong uVar23;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar24;
  pointer *__ptr;
  _Head_base<0UL,_std::complex<double>_*,_false> _Var25;
  bool bVar26;
  allocator_type aVar27;
  iterator pcVar28;
  char *in_R9;
  char *pcVar29;
  long lVar30;
  long lVar31;
  pointer *__ptr_1;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar32;
  undefined1 *puVar33;
  _Head_base<0UL,_std::complex<double>_*,_false> _Var34;
  pointer *__ptr_4;
  bool bVar35;
  byte bVar36;
  initializer_list<std::complex<double>_> __l;
  initializer_list<std::complex<double>_> __l_00;
  initializer_list<std::complex<double>_> __l_01;
  initializer_list<int> __l_02;
  initializer_list<int> __l_03;
  initializer_list<int> __l_04;
  initializer_list<int> __l_05;
  initializer_list<int> __l_06;
  initializer_list<int> __l_07;
  initializer_list<int> __l_08;
  initializer_list<std::complex<double>_> __l_09;
  initializer_list<std::complex<double>_> __l_10;
  initializer_list<std::complex<double>_> __l_11;
  initializer_list<std::complex<double>_> __l_12;
  AssertionResult gtest_ar_5;
  SWAP<std::complex<double>_> swap2;
  AssertionResult gtest_ar__1;
  vector<int,_std::allocator<int>_> qubits;
  SWAP<std::complex<double>_> swap;
  V check4;
  SWAP<std::complex<double>_> swap_2;
  AssertionResult gtest_ar__6;
  stringstream qasm;
  SquareMatrix<std::complex<double>_> I3;
  V v4;
  V v3;
  SquareMatrix<std::complex<double>_> I2;
  SquareMatrix<std::complex<double>_> I1;
  V v2;
  SquareMatrix<std::complex<double>_> I4;
  undefined1 local_330 [8];
  array<int,_2UL> local_328;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_320;
  undefined1 local_310 [8];
  _Head_base<0UL,_std::complex<double>_*,_false> local_308;
  pointer local_300;
  undefined1 local_2f8 [8];
  _Head_base<0UL,_std::complex<double>_*,_false> local_2f0;
  pointer local_2e8;
  undefined1 local_2e0 [8];
  _Head_base<0UL,_std::complex<double>_*,_false> local_2d8;
  pointer local_2d0;
  undefined1 local_2c8 [8];
  array<int,_2UL> local_2c0;
  pointer local_2b8;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> local_2b0;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_298;
  SWAP<std::complex<double>_> local_290;
  AssertHelper local_280;
  AssertHelper local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_270;
  undefined1 local_268 [8];
  _Head_base<0UL,_std::complex<double>_*,_false> _Stack_260;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_258;
  undefined1 *local_248;
  undefined8 uStack_240;
  undefined1 *local_238;
  undefined8 uStack_230;
  ios_base local_1e8 [128];
  undefined1 local_168 [144];
  SquareMatrix<std::complex<double>_> local_d8;
  SquareMatrix<std::complex<double>_> local_c8;
  SquareMatrix<std::complex<double>_> local_b8;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> local_a8;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> local_90;
  SquareMatrix<std::complex<double>_> local_78;
  SquareMatrix<std::complex<double>_> local_68;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> local_58;
  undefined1 local_40 [8];
  void *local_38;
  
  bVar36 = 0;
  qclab::dense::eye<std::complex<double>>((int64_t)&local_68);
  qclab::dense::eye<std::complex<double>>((int64_t)&local_78);
  qclab::dense::eye<std::complex<double>>((int64_t)&local_b8);
  qclab::dense::eye<std::complex<double>>((int64_t)local_40);
  local_238 = &DAT_401c000000000000;
  uStack_230 = 0;
  local_248 = (undefined1 *)0x4000000000000000;
  uStack_240 = 0;
  local_258._M_allocated_capacity = (size_type)&DAT_4014000000000000;
  local_258._8_8_ = 0;
  local_268 = (undefined1  [8])&DAT_4008000000000000;
  _Stack_260._M_head_impl = (complex<double> *)0x0;
  __l._M_len = 4;
  __l._M_array = (iterator)local_268;
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
            (&local_58,__l,(allocator_type *)local_330);
  puVar12 = &DAT_00494a20;
  pcVar28 = (iterator)local_268;
  for (lVar21 = 0x10; lVar21 != 0; lVar21 = lVar21 + -1) {
    *(undefined8 *)pcVar28->_M_value = *puVar12;
    puVar12 = puVar12 + (ulong)bVar36 * -2 + 1;
    pcVar28 = (iterator)(pcVar28[-(ulong)bVar36]._M_value + 8);
  }
  __l_00._M_len = 8;
  __l_00._M_array = (iterator)local_268;
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
            (&local_90,__l_00,(allocator_type *)local_330);
  memcpy((iterator)local_268,&DAT_00494aa0,0x100);
  __l_01._M_len = 0x10;
  __l_01._M_array = (iterator)local_268;
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
            (&local_a8,__l_01,(allocator_type *)local_330);
  local_2c8 = (undefined1  [8])&PTR_nbQubits_00525a88;
  local_2c0._M_elems[0] = 0;
  local_2c0._M_elems[1] = 1;
  local_330._0_4_ = 2;
  local_2e0._0_4_ = 2;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_268,"swap.nbQubits()","2",(int *)local_330,(int *)local_2e0);
  if (local_268[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_330);
    if ((__uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>)
        _Stack_260._M_head_impl ==
        (__uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>)0x0) {
      pcVar29 = "";
    }
    else {
      pcVar29 = *(char **)_Stack_260._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_2e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x15,pcVar29);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_2e0,(Message *)local_330);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2e0);
    if (local_330 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_330 + 8))();
    }
  }
  if (_Stack_260._M_head_impl != (complex<double> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&_Stack_260,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 _Stack_260._M_head_impl);
  }
  local_330._0_4_ = local_2c0._M_elems[0];
  local_2e0 = (undefined1  [8])((ulong)local_2e0 & 0xffffffff00000000);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_268,"swap.qubit()","0",(int *)local_330,(int *)local_2e0);
  if (local_268[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_330);
    if ((__uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>)
        _Stack_260._M_head_impl ==
        (__uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>)0x0) {
      pcVar29 = "";
    }
    else {
      pcVar29 = *(char **)_Stack_260._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_2e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x1a,pcVar29);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_2e0,(Message *)local_330);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2e0);
    if (local_330 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_330 + 8))();
    }
  }
  if (_Stack_260._M_head_impl != (complex<double> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&_Stack_260,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 _Stack_260._M_head_impl);
  }
  local_268._0_4_ = local_2c0._M_elems[0];
  local_268._4_4_ = local_2c0._M_elems[1];
  __l_02._M_len = 2;
  __l_02._M_array = (iterator)local_268;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_2e0,__l_02,(allocator_type *)local_330);
  local_330 = (undefined1  [8])((long)local_2d8._M_head_impl - (long)local_2e0 >> 2);
  local_310._0_4_ = 2;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_268,"qubits.size()","2",(unsigned_long *)local_330,(int *)local_310);
  if (local_268[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_330);
    if (_Stack_260._M_head_impl == (complex<double> *)0x0) {
      pcVar29 = "";
    }
    else {
      pcVar29 = *(char **)_Stack_260._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_310,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x1e,pcVar29);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_310,(Message *)local_330);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_310);
    if (local_330 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_330 + 8))();
    }
  }
  if ((_Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>)
      _Stack_260._M_head_impl != (complex<double> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&_Stack_260,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 _Stack_260._M_head_impl);
  }
  local_330 = (undefined1  [8])((ulong)local_330 & 0xffffffff00000000);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_268,"qubits[0]","0",(int *)local_2e0,(int *)local_330);
  if (local_268[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_330);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_260._M_head_impl
        == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar29 = "";
    }
    else {
      pcVar29 = ((_Alloc_hider *)(_Stack_260._M_head_impl)->_M_value)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_310,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x1f,pcVar29);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_310,(Message *)local_330);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_310);
    if (local_330 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_330 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_260._M_head_impl
      != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&_Stack_260,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 _Stack_260._M_head_impl);
  }
  local_330._0_4_ = 1;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_268,"qubits[1]","1",(int *)((long)local_2e0 + 4),(int *)local_330);
  if (local_268[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_330);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_260._M_head_impl
        == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar29 = "";
    }
    else {
      pcVar29 = ((_Alloc_hider *)(_Stack_260._M_head_impl)->_M_value)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_310,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x20,pcVar29);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_310,(Message *)local_330);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_310);
    if (local_330 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_330 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_260._M_head_impl
      != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&_Stack_260,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 _Stack_260._M_head_impl);
  }
  local_2c0._M_elems = (_Type)&DAT_500000003;
  local_310 = (undefined1  [8])&DAT_500000003;
  __l_03._M_len = 2;
  __l_03._M_array = (iterator)local_310;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_268,__l_03,(allocator_type *)local_2f8);
  local_310._0_4_ = 3;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_330,"swap.qubits()[0]","3",(int *)local_268,(int *)local_310);
  if (local_268 != (undefined1  [8])0x0) {
    operator_delete((void *)local_268,local_258._M_allocated_capacity - (long)local_268);
  }
  if (local_330[0] == (allocator_type)0x0) {
    testing::Message::Message((Message *)local_268);
    if (local_328._M_elems == (_Type)0x0) {
      pcVar29 = "";
    }
    else {
      pcVar29 = *(char **)local_328._M_elems;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_310,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x23,pcVar29);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_310,(Message *)local_268);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_310);
    if (local_268 != (undefined1  [8])0x0) {
      (**(code **)(*(size_type *)local_268 + 8))();
    }
  }
  if (local_328._M_elems != (_Type)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_328,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_328._M_elems);
  }
  local_310._0_4_ = local_2c0._M_elems[0];
  local_310._4_4_ = local_2c0._M_elems[1];
  __l_04._M_len = 2;
  __l_04._M_array = (iterator)local_310;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_268,__l_04,(allocator_type *)local_2f8);
  local_310._0_4_ = 5;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_330,"swap.qubits()[1]","5",(int *)((long)local_268 + 4),
             (int *)local_310);
  if (local_268 != (undefined1  [8])0x0) {
    operator_delete((void *)local_268,local_258._M_allocated_capacity - (long)local_268);
  }
  if (local_330[0] == (allocator_type)0x0) {
    testing::Message::Message((Message *)local_268);
    if (local_328._M_elems == (_Type)0x0) {
      pcVar29 = "";
    }
    else {
      pcVar29 = *(char **)local_328._M_elems;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_310,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x24,pcVar29);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_310,(Message *)local_268);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_310);
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_268 !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(size_type *)local_268 + 8))();
    }
  }
  if (local_328._M_elems != (_Type)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_328,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_328._M_elems);
  }
  local_2c0._M_elems[0] = 0;
  local_2c0._M_elems[1] = 1;
  puVar12 = (undefined8 *)operator_new__(0x100);
  memset(puVar12,0,0x100);
  *puVar12 = 0x3ff0000000000000;
  puVar12[1] = 0;
  puVar12[2] = 0;
  puVar12[3] = 0;
  puVar12[4] = 0;
  puVar12[5] = 0;
  puVar12[6] = 0;
  puVar12[7] = 0;
  puVar12[8] = 0;
  puVar12[9] = 0;
  puVar12[10] = 0;
  puVar12[0xb] = 0;
  puVar12[0xc] = 0x3ff0000000000000;
  puVar12[0xd] = 0;
  puVar12[0xe] = 0;
  puVar12[0xf] = 0;
  puVar12[0x10] = 0;
  puVar12[0x11] = 0;
  puVar12[0x12] = 0x3ff0000000000000;
  puVar12[0x13] = 0;
  puVar12[0x14] = 0;
  puVar12[0x15] = 0;
  puVar12[0x16] = 0;
  puVar12[0x17] = 0;
  puVar12[0x18] = 0;
  puVar12[0x19] = 0;
  puVar12[0x1a] = 0;
  puVar12[0x1b] = 0;
  puVar12[0x1c] = 0;
  puVar12[0x1d] = 0;
  puVar12[0x1e] = 0x3ff0000000000000;
  puVar12[0x1f] = 0;
  puVar13 = (undefined8 *)operator_new__(0x100);
  bVar35 = false;
  memset(puVar13,0,0x100);
  *puVar13 = 0x3ff0000000000000;
  puVar13[1] = 0;
  puVar13[2] = 0;
  puVar13[3] = 0;
  puVar13[4] = 0;
  puVar13[5] = 0;
  puVar13[6] = 0;
  puVar13[7] = 0;
  puVar13[8] = 0;
  puVar13[9] = 0;
  puVar13[10] = 0;
  puVar13[0xb] = 0;
  puVar13[0xc] = 0x3ff0000000000000;
  puVar13[0xd] = 0;
  puVar13[0xe] = 0;
  puVar13[0xf] = 0;
  puVar13[0x10] = 0;
  puVar13[0x11] = 0;
  puVar13[0x12] = 0x3ff0000000000000;
  puVar13[0x13] = 0;
  puVar13[0x14] = 0;
  puVar13[0x15] = 0;
  puVar13[0x16] = 0;
  puVar13[0x17] = 0;
  puVar13[0x18] = 0;
  puVar13[0x19] = 0;
  puVar13[0x1a] = 0;
  puVar13[0x1b] = 0;
  puVar13[0x1c] = 0;
  puVar13[0x1d] = 0;
  puVar13[0x1e] = 0x3ff0000000000000;
  puVar13[0x1f] = 0;
  puVar14 = puVar12 + 3;
  puVar22 = puVar13 + 3;
  uVar23 = 0;
  while( true ) {
    if (((((double)puVar12[uVar23 * 8] != (double)puVar13[uVar23 * 8]) ||
         (NAN((double)puVar12[uVar23 * 8]) || NAN((double)puVar13[uVar23 * 8]))) ||
        ((double)puVar12[uVar23 * 8 + 1] != (double)puVar13[uVar23 * 8 + 1])) ||
       (NAN((double)puVar12[uVar23 * 8 + 1]) || NAN((double)puVar13[uVar23 * 8 + 1]))) break;
    lVar21 = 0;
    while (lVar21 + 0x10 != 0x40) {
      dVar5 = *(double *)((long)puVar14 + lVar21 + -8);
      pdVar20 = (double *)((long)puVar22 + lVar21 + -8);
      if ((dVar5 != *pdVar20) || (NAN(dVar5) || NAN(*pdVar20))) goto LAB_0036cd54;
      pdVar20 = (double *)((long)puVar14 + lVar21);
      pdVar17 = (double *)((long)puVar22 + lVar21);
      if ((*pdVar20 != *pdVar17) || (lVar21 = lVar21 + 0x10, NAN(*pdVar20) || NAN(*pdVar17)))
      goto LAB_0036cd54;
    }
    bVar35 = 2 < uVar23;
    uVar23 = uVar23 + 1;
    puVar14 = puVar14 + 8;
    puVar22 = puVar22 + 8;
    if (uVar23 == 4) break;
  }
LAB_0036cd54:
  local_330[0] = (allocator_type)bVar35;
  local_328._M_elems[0] = 0;
  local_328._M_elems[1] = 0;
  operator_delete__(puVar13);
  if (local_330[0] == (allocator_type)0x0) {
    testing::Message::Message((Message *)local_310);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_268,(internal *)local_330,
               (AssertionResult *)"swap.matrix() == SWAP_check","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_2f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x2e,(char *)local_268);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_2f8,(Message *)local_310);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2f8);
    if (local_268 != (undefined1  [8])&local_258) {
      operator_delete((void *)local_268,(ulong)(local_258._M_allocated_capacity + 1));
    }
    if (local_310 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_310 + 8))();
    }
  }
  if (local_328._M_elems != (_Type)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_328,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_328._M_elems);
  }
  qclab::qgates::QGate2<std::complex<double>_>::print((QGate2<std::complex<double>_> *)local_2c8);
  std::__cxx11::stringstream::stringstream((stringstream *)local_268);
  iVar11 = qclab::qgates::SWAP<std::complex<double>_>::toQASM
                     ((SWAP<std::complex<double>_> *)local_2c8,(ostream *)local_258._M_local_buf,0);
  local_310._0_4_ = iVar11;
  local_2f8 = (undefined1  [8])((ulong)(uint)local_2f8._4_4_ << 0x20);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_330,"swap.toQASM( qasm )","0",(int *)local_310,(int *)local_2f8);
  if (local_330[0] == (allocator_type)0x0) {
    testing::Message::Message((Message *)local_310);
    if (local_328._M_elems == (_Type)0x0) {
      pcVar29 = "";
    }
    else {
      pcVar29 = *(char **)local_328._M_elems;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_2f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x35,pcVar29);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_2f8,(Message *)local_310);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2f8);
    if (local_310 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_310 + 8))();
    }
  }
  if (local_328._M_elems != (_Type)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_328,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_328._M_elems);
  }
  std::__cxx11::stringbuf::str();
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[18]>
            ((internal *)local_310,"qasm.str()","\"swap q[0], q[1];\\n\"",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_330,
             (char (*) [18])0x4953ae);
  if (local_330 != (undefined1  [8])&local_320) {
    operator_delete((void *)local_330,local_320._M_allocated_capacity + 1);
  }
  if (local_310[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_330);
    if (local_308._M_head_impl == (complex<double> *)0x0) {
      pcVar29 = "";
    }
    else {
      pcVar29 = *(char **)local_308._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_2f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x36,pcVar29);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_2f8,(Message *)local_330);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2f8);
    if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )local_330 !=
        (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )0x0) {
      (**(code **)(*(size_type *)local_330 + 8))();
    }
  }
  if ((_Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>)
      local_308._M_head_impl != (complex<double> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_308,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_308._M_head_impl);
  }
  std::__cxx11::stringbuf::str();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,(char *)local_330,(long)local_328._M_elems);
  if (local_330 != (undefined1  [8])&local_320) {
    operator_delete((void *)local_330,local_320._M_allocated_capacity + 1);
  }
  local_310 = (undefined1  [8])&PTR_nbQubits_00525a88;
  local_308._M_head_impl = (complex<double> *)0x400000002;
  iVar11 = (**(_func_int **)((long)local_2c8 + 0x70))();
  local_2f8[0] = (allocator_type)(char)iVar11;
  local_2f0._M_head_impl = (complex<double> *)0x0;
  if ((char)iVar11 == '\0') {
    testing::Message::Message((Message *)&local_2b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_330,(internal *)local_2f8,(AssertionResult *)"swap == swap2","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_290,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x3b,(char *)local_330);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_290,(Message *)&local_2b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_290);
    if (local_330 != (undefined1  [8])&local_320) {
      operator_delete((void *)local_330,local_320._M_allocated_capacity + 1);
    }
    if (local_2b0.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*(long *)(local_2b0.
                             super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->_M_value + 8))();
    }
  }
  if (local_2f0._M_head_impl != (complex<double> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_2f0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_2f0._M_head_impl);
  }
  iVar11 = (**(_func_int **)((long)local_2c8 + 0x70))(local_2c8,local_310);
  local_2f8[0] = (allocator_type)(char)iVar11;
  local_2f0._M_head_impl = (complex<double> *)0x0;
  if ((char)iVar11 == '\0') {
    testing::Message::Message((Message *)&local_2b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_330,(internal *)local_2f8,(AssertionResult *)"swap != swap2","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_290,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x3c,(char *)local_330);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_290,(Message *)&local_2b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_290);
    if (local_330 != (undefined1  [8])&local_320) {
      operator_delete((void *)local_330,local_320._M_allocated_capacity + 1);
    }
    if (local_2b0.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*(long *)(local_2b0.
                             super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->_M_value + 8))();
    }
  }
  if (local_2f0._M_head_impl != (complex<double> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_2f0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_2f0._M_head_impl);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)local_268);
  std::ios_base::~ios_base(local_1e8);
  operator_delete__(puVar12);
  if (local_2e0 != (undefined1  [8])0x0) {
    operator_delete((void *)local_2e0,(long)local_2d0 - (long)local_2e0);
  }
  local_330._0_4_ = 2;
  local_2e0._0_4_ = 2;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_268,"swap.nbQubits()","2",(int *)local_330,(int *)local_2e0);
  if (local_268[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_330);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_260._M_head_impl
        == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar29 = "";
    }
    else {
      pcVar29 = ((_Alloc_hider *)(_Stack_260._M_head_impl)->_M_value)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_2e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x42,pcVar29);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_2e0,(Message *)local_330);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2e0);
    if (local_330 != (undefined1  [8])0x0) {
      (**(code **)((long)*(double *)local_330 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_260._M_head_impl
      != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&_Stack_260,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 _Stack_260._M_head_impl);
  }
  local_2e0 = (undefined1  [8])&DAT_500000003;
  __l_05._M_len = 2;
  __l_05._M_array = (iterator)local_2e0;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_268,__l_05,(allocator_type *)local_2c8);
  local_2e0._0_4_ = 3;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_330,"swap.qubits()[0]","3",(int *)local_268,(int *)local_2e0);
  if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
       )local_268 !=
      (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )0x0) {
    operator_delete((void *)local_268,local_258._M_allocated_capacity - (long)local_268);
  }
  if (local_330[0] == (allocator_type)0x0) {
    testing::Message::Message((Message *)local_268);
    if (local_328._M_elems == (_Type)0x0) {
      pcVar29 = "";
    }
    else {
      pcVar29 = *(char **)local_328._M_elems;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_2e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x45,pcVar29);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_2e0,(Message *)local_268);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2e0);
    if (local_268 != (undefined1  [8])0x0) {
      (**(code **)(*(size_type *)local_268 + 8))();
    }
  }
  if (local_328._M_elems != (_Type)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_328,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_328._M_elems);
  }
  local_2e0 = (undefined1  [8])&DAT_500000003;
  __l_06._M_len = 2;
  __l_06._M_array = (iterator)local_2e0;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_268,__l_06,(allocator_type *)local_2c8);
  local_2e0._0_4_ = 5;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_330,"swap.qubits()[1]","5",(int *)((long)local_268 + 4),
             (int *)local_2e0);
  if (local_268 != (undefined1  [8])0x0) {
    operator_delete((void *)local_268,local_258._M_allocated_capacity - (long)local_268);
  }
  if (local_330[0] == (allocator_type)0x0) {
    testing::Message::Message((Message *)local_268);
    if (local_328._M_elems == (_Type)0x0) {
      pcVar29 = "";
    }
    else {
      pcVar29 = *(char **)local_328._M_elems;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_2e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x46,pcVar29);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_2e0,(Message *)local_268);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2e0);
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_268 !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(size_type *)local_268 + 8))();
    }
  }
  if (local_328._M_elems != (_Type)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_328,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_328._M_elems);
  }
  local_310 = (undefined1  [8])&DAT_500000003;
  qclab::qgates::SWAP<std::complex<double>_>::SWAP
            ((SWAP<std::complex<double>_> *)local_330,(int *)local_310);
  local_2e0._0_4_ = 2;
  local_2c8._0_4_ = 2;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_268,"swap.nbQubits()","2",(int *)local_2e0,(int *)local_2c8);
  if (local_268[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_2e0);
    if ((__uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>)
        _Stack_260._M_head_impl ==
        (__uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>)0x0) {
      pcVar29 = "";
    }
    else {
      pcVar29 = *(char **)_Stack_260._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_2c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x4d,pcVar29);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_2c8,(Message *)local_2e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2c8);
    if (local_2e0 != (undefined1  [8])0x0) {
      (**(code **)((long)*(double *)local_2e0 + 8))();
    }
  }
  if (_Stack_260._M_head_impl != (complex<double> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&_Stack_260,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 _Stack_260._M_head_impl);
  }
  local_2c8._0_4_ = local_328._M_elems[0];
  local_2c8._4_4_ = local_328._M_elems[1];
  __l_07._M_len = 2;
  __l_07._M_array = (iterator)local_2c8;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_268,__l_07,(allocator_type *)local_2f8);
  local_2c8._0_4_ = 3;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_2e0,"swap.qubits()[0]","3",(int *)local_268,(int *)local_2c8);
  if (local_268 != (undefined1  [8])0x0) {
    operator_delete((void *)local_268,local_258._M_allocated_capacity - (long)local_268);
  }
  if (local_2e0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_268);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d8._M_head_impl
        == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar29 = "";
    }
    else {
      pcVar29 = ((_Alloc_hider *)(local_2d8._M_head_impl)->_M_value)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_2c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x50,pcVar29);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_2c8,(Message *)local_268);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2c8);
    if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )local_268 !=
        (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )0x0) {
      (**(code **)(*(size_type *)local_268 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d8._M_head_impl !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_2d8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_2d8._M_head_impl);
  }
  local_2c8._0_4_ = local_328._M_elems[0];
  local_2c8._4_4_ = local_328._M_elems[1];
  __l_08._M_len = 2;
  __l_08._M_array = (iterator)local_2c8;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_268,__l_08,(allocator_type *)local_2f8);
  local_2c8._0_4_ = 5;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_2e0,"swap.qubits()[1]","5",(int *)((long)local_268 + 4),
             (int *)local_2c8);
  if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )local_268 != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  {
    operator_delete((void *)local_268,local_258._M_allocated_capacity - (long)local_268);
  }
  if (local_2e0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_268);
    if (local_2d8._M_head_impl == (complex<double> *)0x0) {
      pcVar29 = "";
    }
    else {
      pcVar29 = *(char **)local_2d8._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_2c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x51,pcVar29);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_2c8,(Message *)local_268);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2c8);
    if (local_268 != (undefined1  [8])0x0) {
      (**(code **)(*(size_type *)local_268 + 8))();
    }
  }
  if ((_Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>)
      local_2d8._M_head_impl != (complex<double> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_2d8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_2d8._M_head_impl);
  }
  local_290.super_QGate2<std::complex<double>_>.super_QObject<std::complex<double>_>._vptr_QObject =
       (QObject<std::complex<double>_>)&PTR_nbQubits_00525a88;
  local_290.qubits_._M_elems[0] = 0;
  local_290.qubits_._M_elems[1] = 1;
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_330,
             &local_58);
  qclab::qgates::SWAP<std::complex<double>_>::apply
            (&local_290,NoTrans,2,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_330,0);
  local_238 = &DAT_401c000000000000;
  uStack_230 = 0;
  local_248 = &DAT_4014000000000000;
  uStack_240 = 0;
  local_258._M_allocated_capacity = (size_type)&DAT_4000000000000000;
  local_258._8_8_ = 0;
  local_268 = (undefined1  [8])&DAT_4008000000000000;
  _Stack_260._M_head_impl = (complex<double> *)0x0;
  __l_09._M_len = 4;
  __l_09._M_array = (iterator)local_268;
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_2e0,
             __l_09,(allocator_type *)local_2c8);
  if ((long)local_328._M_elems - (long)local_330 == (long)local_2d8._M_head_impl - (long)local_2e0)
  {
    bVar35 = (_Type)local_330 == local_328._M_elems;
    if ((_Type)local_330 != local_328._M_elems) {
      bVar26 = false;
      bVar35 = false;
      if ((*(double *)local_330 == *(double *)local_2e0) &&
         (bVar35 = bVar26, !NAN(*(double *)local_330) && !NAN(*(double *)local_2e0))) {
        if ((*(double *)((long)local_330 + 8) == (double)*(char **)((long)local_2e0 + 8)) &&
           (!NAN(*(double *)((long)local_330 + 8)) && !NAN((double)*(char **)((long)local_2e0 + 8)))
           ) {
          paVar24 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)((long)local_2e0 + 0x18);
          _Var8._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl =
               (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )(tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )local_330;
          while( true ) {
            _Var15.
            super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl =
                 (__uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )((long)_Var8._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl + 0x10);
            bVar35 = _Var15.
                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl ==
                     (__uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )local_328._M_elems;
            if (bVar35) break;
            bVar35 = false;
            if ((*(double *)
                  _Var15.
                  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl != *(double *)((long)paVar24 + -8)) ||
               (NAN(*(double *)
                     _Var15.
                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl) || NAN(*(double *)((long)paVar24 + -8)))) break;
            pdVar20 = (double *)
                      ((long)_Var8._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl + 0x18);
            dVar5 = *(double *)paVar24;
            dVar6 = *(double *)paVar24;
            paVar24 = paVar24 + 1;
            if ((*pdVar20 != dVar6) ||
               (_Var8._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl =
                     (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )(tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )_Var15.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl, NAN(*pdVar20) || NAN(dVar5))) break;
          }
        }
      }
    }
  }
  else {
    bVar35 = false;
  }
  local_2c8[0] = (allocator_type)bVar35;
  local_2c0._M_elems[0] = 0;
  local_2c0._M_elems[1] = 0;
  if (bVar35 == false) {
    testing::Message::Message((Message *)local_310);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_268,(internal *)local_2c8,(AssertionResult *)"vec2 == check2","false"
               ,"true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_2f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x5b,(char *)local_268);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_2f8,(Message *)local_310);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2f8);
    if (local_268 != (undefined1  [8])&local_258) {
      operator_delete((void *)local_268,(ulong)(local_258._M_allocated_capacity + 1));
    }
    if (local_310 != (undefined1  [8])0x0) {
      (**(code **)((long)*(double *)local_310 + 8))();
    }
  }
  if (local_2c0._M_elems != (_Type)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_2c0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_2c0._M_elems);
  }
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_2c8,
             &local_90);
  qclab::qgates::SWAP<std::complex<double>_>::apply
            (&local_290,NoTrans,3,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_2c8,0);
  puVar12 = &DAT_00494be0;
  pcVar28 = (iterator)local_268;
  for (lVar21 = 0x10; lVar21 != 0; lVar21 = lVar21 + -1) {
    *(undefined8 *)pcVar28->_M_value = *puVar12;
    puVar12 = puVar12 + (ulong)bVar36 * -2 + 1;
    pcVar28 = (iterator)(pcVar28[-(ulong)bVar36]._M_value + 8);
  }
  __l_10._M_len = 8;
  __l_10._M_array = (iterator)local_268;
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_310,
             __l_10,(allocator_type *)local_2f8);
  if ((long)local_2c0._M_elems - (long)local_2c8 == (long)local_308._M_head_impl - (long)local_310)
  {
    bVar35 = (_Type)local_2c8 == local_2c0._M_elems;
    if ((_Type)local_2c8 != local_2c0._M_elems) {
      bVar26 = false;
      bVar35 = false;
      if ((*(double *)local_2c8 == *(double *)local_310) &&
         (bVar35 = bVar26, !NAN(*(double *)local_2c8) && !NAN(*(double *)local_310))) {
        if (((double)*(char **)((long)local_2c8 + 8) == (double)*(char **)((long)local_310 + 8)) &&
           (!NAN((double)*(char **)((long)local_2c8 + 8)) &&
            !NAN((double)*(char **)((long)local_310 + 8)))) {
          paVar24 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)((long)local_310 + 0x18);
          QVar9._vptr_QObject = (_func_int **)local_2c8;
          while( true ) {
            aiVar18 = (_Type)(QVar9._vptr_QObject + 2);
            bVar35 = aiVar18 == local_2c0._M_elems;
            if (bVar35) break;
            bVar35 = false;
            if ((*(double *)aiVar18 != *(double *)((long)paVar24 + -8)) ||
               (NAN(*(double *)aiVar18) || NAN(*(double *)((long)paVar24 + -8)))) break;
            pp_Var1 = QVar9._vptr_QObject + 3;
            dVar5 = *(double *)paVar24;
            dVar6 = *(double *)paVar24;
            paVar24 = paVar24 + 1;
            if (((double)*pp_Var1 != dVar6) ||
               (QVar9._vptr_QObject = (_func_int **)aiVar18, NAN((double)*pp_Var1) || NAN(dVar5)))
            break;
          }
        }
      }
    }
  }
  else {
    bVar35 = false;
  }
  local_2f8[0] = (allocator_type)bVar35;
  local_2f0._M_head_impl = (complex<double> *)0x0;
  if (bVar35 == false) {
    testing::Message::Message((Message *)&local_2b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_268,(internal *)local_2f8,(AssertionResult *)"vec3 == check3","false"
               ,"true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_278,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x67,(char *)local_268);
    testing::internal::AssertHelper::operator=(&local_278,(Message *)&local_2b0);
    testing::internal::AssertHelper::~AssertHelper(&local_278);
    if (local_268 != (undefined1  [8])&local_258) {
      operator_delete((void *)local_268,(ulong)(local_258._M_allocated_capacity + 1));
    }
    if (local_2b0.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*(long *)(local_2b0.
                             super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->_M_value + 8))();
    }
  }
  if (local_2f0._M_head_impl != (complex<double> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_2f0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_2f0._M_head_impl);
  }
  local_290.qubits_._M_elems[0] = 1;
  local_290.qubits_._M_elems[1] = 2;
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::operator=
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_2c8,
             &local_90);
  qclab::qgates::SWAP<std::complex<double>_>::apply
            (&local_290,NoTrans,3,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_2c8,0);
  puVar12 = &DAT_00494c60;
  puVar13 = (undefined8 *)local_268;
  for (lVar21 = 0x10; lVar21 != 0; lVar21 = lVar21 + -1) {
    *puVar13 = *puVar12;
    puVar12 = puVar12 + (ulong)bVar36 * -2 + 1;
    puVar13 = puVar13 + (ulong)bVar36 * -2 + 1;
  }
  std::vector<std::complex<double>,std::allocator<std::complex<double>>>::
  _M_assign_aux<std::complex<double>const*>
            ((vector<std::complex<double>,std::allocator<std::complex<double>>> *)local_310,
             local_268,local_1e8);
  if ((long)local_2c0._M_elems - (long)local_2c8 == (long)local_308._M_head_impl - (long)local_310)
  {
    bVar35 = (_Type)local_2c8 == local_2c0._M_elems;
    if ((_Type)local_2c8 != local_2c0._M_elems) {
      bVar26 = false;
      bVar35 = false;
      if ((*(double *)local_2c8 == *(double *)local_310) &&
         (bVar35 = bVar26, !NAN(*(double *)local_2c8) && !NAN(*(double *)local_310))) {
        if (((double)*(char **)((long)local_2c8 + 8) == (double)*(char **)((long)local_310 + 8)) &&
           (!NAN((double)*(char **)((long)local_2c8 + 8)) &&
            !NAN((double)*(char **)((long)local_310 + 8)))) {
          paVar24 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)((long)local_310 + 0x18);
          QVar9._vptr_QObject = (_func_int **)local_2c8;
          while( true ) {
            aiVar18 = (_Type)(QVar9._vptr_QObject + 2);
            bVar35 = aiVar18 == local_2c0._M_elems;
            if (bVar35) break;
            bVar35 = false;
            if ((*(double *)aiVar18 != *(double *)((long)paVar24 + -8)) ||
               (NAN(*(double *)aiVar18) || NAN(*(double *)((long)paVar24 + -8)))) break;
            pp_Var1 = QVar9._vptr_QObject + 3;
            dVar5 = *(double *)paVar24;
            dVar6 = *(double *)paVar24;
            paVar24 = paVar24 + 1;
            if (((double)*pp_Var1 != dVar6) ||
               (QVar9._vptr_QObject = (_func_int **)aiVar18, NAN((double)*pp_Var1) || NAN(dVar5)))
            break;
          }
        }
      }
    }
  }
  else {
    bVar35 = false;
  }
  local_2f8[0] = (allocator_type)bVar35;
  local_2f0._M_head_impl = (complex<double> *)0x0;
  if (bVar35 == false) {
    testing::Message::Message((Message *)&local_2b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_268,(internal *)local_2f8,(AssertionResult *)"vec3 == check3","false"
               ,"true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_278,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x74,(char *)local_268);
    testing::internal::AssertHelper::operator=(&local_278,(Message *)&local_2b0);
    testing::internal::AssertHelper::~AssertHelper(&local_278);
    if (local_268 != (undefined1  [8])&local_258) {
      operator_delete((void *)local_268,(ulong)(local_258._M_allocated_capacity + 1));
    }
    if (local_2b0.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*(long *)(local_2b0.
                             super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->_M_value + 8))();
    }
  }
  if (local_2f0._M_head_impl != (complex<double> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_2f0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_2f0._M_head_impl);
  }
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_2f8,
             &local_a8);
  qclab::qgates::SWAP<std::complex<double>_>::apply
            (&local_290,NoTrans,4,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_2f8,0);
  memcpy((iterator)local_268,&DAT_00494ce0,0x100);
  __l_11._M_len = 0x10;
  __l_11._M_array = (iterator)local_268;
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
            (&local_2b0,__l_11,(allocator_type *)&local_278);
  if ((long)local_2f0._M_head_impl - (long)local_2f8 ==
      (long)local_2b0.
            super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl
            .super__Vector_impl_data._M_finish -
      (long)local_2b0.
            super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl
            .super__Vector_impl_data._M_start) {
    local_278.data_._0_1_ = (allocator_type)(local_2f8 == (undefined1  [8])local_2f0._M_head_impl);
    if (local_2f8 != (undefined1  [8])local_2f0._M_head_impl) {
      aVar27 = (allocator_type)0x0;
      local_278.data_._0_1_ = (allocator_type)0x0;
      if ((*(double *)local_2f8 ==
           *(double *)
            (local_2b0.
             super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
             _M_impl.super__Vector_impl_data._M_start)->_M_value) &&
         (local_278.data_._0_1_ = aVar27,
         !NAN(*(double *)local_2f8) &&
         !NAN(*(double *)
               (local_2b0.
                super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
                _M_impl.super__Vector_impl_data._M_start)->_M_value))) {
        lVar21 = (long)(local_2b0.
                        super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->_M_value + 8;
        if (((double)*(char **)((long)local_2f8 + 8) == *(double *)lVar21) &&
           (!NAN((double)*(char **)((long)local_2f8 + 8)) && !NAN(*(double *)lVar21))) {
          pdVar20 = (double *)
                    (local_2b0.
                     super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[1]._M_value + 8);
          auVar10 = local_2f8;
          while( true ) {
            paVar24 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)&((AssertHelperData *)auVar10)->line;
            local_278.data_._0_1_ =
                 (allocator_type)
                 (paVar24 ==
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_2f0._M_head_impl);
            if ((bool)local_278.data_._0_1_) break;
            local_278.data_._0_1_ = (allocator_type)0x0;
            if ((*(double *)paVar24 != pdVar20[-1]) || (NAN(*(double *)paVar24) || NAN(pdVar20[-1]))
               ) break;
            pcVar7 = (((AssertHelperData *)auVar10)->message)._M_dataplus._M_p;
            dVar5 = *pdVar20;
            dVar6 = *pdVar20;
            pdVar20 = pdVar20 + 2;
            if (((double)pcVar7 != dVar6) ||
               (auVar10 = (undefined1  [8])paVar24, NAN((double)pcVar7) || NAN(dVar5))) break;
          }
        }
      }
    }
  }
  else {
    local_278.data_._0_1_ = (allocator_type)0x0;
  }
  local_270 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_278.data_._0_1_ == (allocator_type)0x0) {
    testing::Message::Message((Message *)&local_298);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_268,(internal *)&local_278,(AssertionResult *)"vec4 == check4",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_280,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x80,(char *)local_268);
    testing::internal::AssertHelper::operator=(&local_280,(Message *)&local_298);
    testing::internal::AssertHelper::~AssertHelper(&local_280);
    if (local_268 != (undefined1  [8])&local_258) {
      operator_delete((void *)local_268,(ulong)(local_258._M_allocated_capacity + 1));
    }
    if (local_298._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_298._M_head_impl + 8))();
    }
  }
  if (local_270 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_270,local_270);
  }
  local_290.qubits_._M_elems[0] = 0;
  local_290.qubits_._M_elems[1] = 1;
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::operator=
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_2f8,
             &local_a8);
  qclab::qgates::SWAP<std::complex<double>_>::apply
            (&local_290,NoTrans,4,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_2f8,0);
  memcpy(local_268,&DAT_00494de0,0x100);
  std::vector<std::complex<double>,std::allocator<std::complex<double>>>::
  _M_assign_aux<std::complex<double>const*>
            ((vector<std::complex<double>,std::allocator<std::complex<double>>> *)&local_2b0,
             local_268,local_168);
  if ((long)local_2f0._M_head_impl - (long)local_2f8 ==
      (long)local_2b0.
            super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl
            .super__Vector_impl_data._M_finish -
      (long)local_2b0.
            super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl
            .super__Vector_impl_data._M_start) {
    local_278.data_._0_1_ = (allocator_type)(local_2f8 == (undefined1  [8])local_2f0._M_head_impl);
    if (local_2f8 != (undefined1  [8])local_2f0._M_head_impl) {
      aVar27 = (allocator_type)0x0;
      local_278.data_._0_1_ = (allocator_type)0x0;
      if ((*(double *)local_2f8 ==
           *(double *)
            (local_2b0.
             super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
             _M_impl.super__Vector_impl_data._M_start)->_M_value) &&
         (local_278.data_._0_1_ = aVar27,
         !NAN(*(double *)local_2f8) &&
         !NAN(*(double *)
               (local_2b0.
                super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
                _M_impl.super__Vector_impl_data._M_start)->_M_value))) {
        lVar21 = (long)(local_2b0.
                        super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->_M_value + 8;
        if (((double)*(char **)((long)local_2f8 + 8) == *(double *)lVar21) &&
           (!NAN((double)*(char **)((long)local_2f8 + 8)) && !NAN(*(double *)lVar21))) {
          pdVar20 = (double *)
                    (local_2b0.
                     super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[1]._M_value + 8);
          auVar10 = local_2f8;
          while( true ) {
            paVar24 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)&((AssertHelperData *)auVar10)->line;
            local_278.data_._0_1_ =
                 (allocator_type)
                 (paVar24 ==
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_2f0._M_head_impl);
            if ((bool)local_278.data_._0_1_) break;
            local_278.data_._0_1_ = (allocator_type)0x0;
            if ((*(double *)paVar24 != pdVar20[-1]) || (NAN(*(double *)paVar24) || NAN(pdVar20[-1]))
               ) break;
            pcVar7 = (((AssertHelperData *)auVar10)->message)._M_dataplus._M_p;
            dVar5 = *pdVar20;
            dVar6 = *pdVar20;
            pdVar20 = pdVar20 + 2;
            if (((double)pcVar7 != dVar6) ||
               (auVar10 = (undefined1  [8])paVar24, NAN((double)pcVar7) || NAN(dVar5))) break;
          }
        }
      }
    }
  }
  else {
    local_278.data_._0_1_ = (allocator_type)0x0;
  }
  local_270 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_278.data_._0_1_ == (allocator_type)0x0) {
    testing::Message::Message((Message *)&local_298);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_268,(internal *)&local_278,(AssertionResult *)"vec4 == check4",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_280,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x8e,(char *)local_268);
    testing::internal::AssertHelper::operator=(&local_280,(Message *)&local_298);
    testing::internal::AssertHelper::~AssertHelper(&local_280);
    if (local_268 != (undefined1  [8])&local_258) {
      operator_delete((void *)local_268,(ulong)(local_258._M_allocated_capacity + 1));
    }
    if (local_298._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_298._M_head_impl + 8))();
    }
  }
  if (local_270 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_270,local_270);
  }
  local_290.qubits_._M_elems = (_Type)&DAT_300000002;
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::operator=
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_2f8,
             &local_a8);
  qclab::qgates::SWAP<std::complex<double>_>::apply
            (&local_290,NoTrans,4,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_2f8,0);
  memcpy(local_268,&DAT_00494ee0,0x100);
  std::vector<std::complex<double>,std::allocator<std::complex<double>>>::
  _M_assign_aux<std::complex<double>const*>
            ((vector<std::complex<double>,std::allocator<std::complex<double>>> *)&local_2b0,
             local_268,local_168);
  if ((long)local_2f0._M_head_impl - (long)local_2f8 ==
      (long)local_2b0.
            super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl
            .super__Vector_impl_data._M_finish -
      (long)local_2b0.
            super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl
            .super__Vector_impl_data._M_start) {
    local_278.data_._0_1_ = (allocator_type)(local_2f8 == (undefined1  [8])local_2f0._M_head_impl);
    if (local_2f8 != (undefined1  [8])local_2f0._M_head_impl) {
      aVar27 = (allocator_type)0x0;
      local_278.data_._0_1_ = (allocator_type)0x0;
      if ((*(double *)local_2f8 ==
           *(double *)
            (local_2b0.
             super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
             _M_impl.super__Vector_impl_data._M_start)->_M_value) &&
         (local_278.data_._0_1_ = aVar27,
         !NAN(*(double *)local_2f8) &&
         !NAN(*(double *)
               (local_2b0.
                super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
                _M_impl.super__Vector_impl_data._M_start)->_M_value))) {
        lVar21 = (long)(local_2b0.
                        super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->_M_value + 8;
        if (((double)*(char **)((long)local_2f8 + 8) == *(double *)lVar21) &&
           (!NAN((double)*(char **)((long)local_2f8 + 8)) && !NAN(*(double *)lVar21))) {
          pdVar20 = (double *)
                    (local_2b0.
                     super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[1]._M_value + 8);
          auVar10 = local_2f8;
          while( true ) {
            paVar24 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)&((AssertHelperData *)auVar10)->line;
            local_278.data_._0_1_ =
                 (allocator_type)
                 (paVar24 ==
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_2f0._M_head_impl);
            if ((bool)local_278.data_._0_1_) break;
            local_278.data_._0_1_ = (allocator_type)0x0;
            if ((*(double *)paVar24 != pdVar20[-1]) || (NAN(*(double *)paVar24) || NAN(pdVar20[-1]))
               ) break;
            pcVar7 = (((AssertHelperData *)auVar10)->message)._M_dataplus._M_p;
            dVar5 = *pdVar20;
            dVar6 = *pdVar20;
            pdVar20 = pdVar20 + 2;
            if (((double)pcVar7 != dVar6) ||
               (auVar10 = (undefined1  [8])paVar24, NAN((double)pcVar7) || NAN(dVar5))) break;
          }
        }
      }
    }
  }
  else {
    local_278.data_._0_1_ = (allocator_type)0x0;
  }
  local_270 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_278.data_._0_1_ == (allocator_type)0x0) {
    testing::Message::Message((Message *)&local_298);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_268,(internal *)&local_278,(AssertionResult *)"vec4 == check4",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_280,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x9c,(char *)local_268);
    testing::internal::AssertHelper::operator=(&local_280,(Message *)&local_298);
    testing::internal::AssertHelper::~AssertHelper(&local_280);
    if (local_268 != (undefined1  [8])&local_258) {
      operator_delete((void *)local_268,(ulong)(local_258._M_allocated_capacity + 1));
    }
    if (local_298._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_298._M_head_impl + 8))();
    }
  }
  if (local_270 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_270,local_270);
  }
  if (local_2b0.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2b0.
                    super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_2b0.
                          super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2b0.
                          super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_2f8 != (undefined1  [8])0x0) {
    operator_delete((void *)local_2f8,(long)local_2e8 - (long)local_2f8);
  }
  if (local_310 != (undefined1  [8])0x0) {
    operator_delete((void *)local_310,(long)local_300 - (long)local_310);
  }
  if (local_2c8 != (undefined1  [8])0x0) {
    operator_delete((void *)local_2c8,(long)local_2b8 - (long)local_2c8);
  }
  if (local_2e0 != (undefined1  [8])0x0) {
    operator_delete((void *)local_2e0,(long)local_2d0 - (long)local_2e0);
  }
  if (local_330 != (undefined1  [8])0x0) {
    operator_delete((void *)local_330,local_320._M_allocated_capacity - (long)local_330);
  }
  local_2c8 = (undefined1  [8])&PTR_nbQubits_00525a88;
  local_2c0._M_elems[0] = 0;
  local_2c0._M_elems[1] = 2;
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_330,
             &local_90);
  qclab::qgates::SWAP<std::complex<double>_>::apply
            ((SWAP<std::complex<double>_> *)local_2c8,NoTrans,3,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_330,0);
  puVar12 = &DAT_00494fe0;
  pcVar28 = (iterator)local_268;
  for (lVar21 = 0x10; lVar21 != 0; lVar21 = lVar21 + -1) {
    *(undefined8 *)pcVar28->_M_value = *puVar12;
    puVar12 = puVar12 + (ulong)bVar36 * -2 + 1;
    pcVar28 = (iterator)(pcVar28[-(ulong)bVar36]._M_value + 8);
  }
  __l_12._M_len = 8;
  __l_12._M_array = (iterator)local_268;
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_2e0,
             __l_12,(allocator_type *)local_310);
  if ((long)local_328._M_elems - (long)local_330 == (long)local_2d8._M_head_impl - (long)local_2e0)
  {
    bVar35 = (_Type)local_330 == local_328._M_elems;
    if ((_Type)local_330 != local_328._M_elems) {
      bVar26 = false;
      bVar35 = false;
      if ((*(double *)local_330 == *(double *)local_2e0) &&
         (bVar35 = bVar26, !NAN(*(double *)local_330) && !NAN(*(double *)local_2e0))) {
        if ((*(double *)((long)local_330 + 8) == (double)*(char **)((long)local_2e0 + 8)) &&
           (!NAN(*(double *)((long)local_330 + 8)) && !NAN((double)*(char **)((long)local_2e0 + 8)))
           ) {
          paVar24 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)((long)local_2e0 + 0x18);
          aiVar18 = (_Type)local_330;
          while( true ) {
            aiVar16 = (_Type)((long)aiVar18 + 0x10);
            bVar35 = aiVar16 == local_328._M_elems;
            if (bVar35) break;
            bVar35 = false;
            if ((*(double *)aiVar16 != *(double *)((long)paVar24 + -8)) ||
               (NAN(*(double *)aiVar16) || NAN(*(double *)((long)paVar24 + -8)))) break;
            pdVar20 = (double *)((long)aiVar18 + 0x18);
            dVar6 = *(double *)paVar24;
            dVar5 = *(double *)paVar24;
            paVar24 = paVar24 + 1;
            if ((*pdVar20 != dVar5) || (aiVar18 = aiVar16, NAN(*pdVar20) || NAN(dVar6))) break;
          }
        }
      }
    }
  }
  else {
    bVar35 = false;
  }
  local_310[0] = (internal)bVar35;
  local_308._M_head_impl = (complex<double> *)0x0;
  if (bVar35 == false) {
    testing::Message::Message((Message *)local_2f8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_268,(internal *)local_310,(AssertionResult *)"vec3 == check3","false"
               ,"true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0xac,(char *)local_268);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2b0,(Message *)local_2f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2b0);
    if (local_268 != (undefined1  [8])&local_258) {
      operator_delete((void *)local_268,(ulong)(local_258._M_allocated_capacity + 1));
    }
    if (local_2f8 != (undefined1  [8])0x0) {
      (**(code **)((long)*(double *)local_2f8 + 8))();
    }
  }
  if (local_308._M_head_impl != (complex<double> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_308,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_308._M_head_impl);
  }
  if (local_2e0 != (undefined1  [8])0x0) {
    operator_delete((void *)local_2e0,(long)local_2d0 - (long)local_2e0);
  }
  if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       )local_330 !=
      (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       )0x0) {
    operator_delete((void *)local_330,local_320._M_allocated_capacity - (long)local_330);
  }
  local_330 = (undefined1  [8])&PTR_nbQubits_00525a88;
  local_328._M_elems[0] = 0;
  local_328._M_elems[1] = 1;
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)local_2e0,&local_78);
  pdVar20 = (double *)0x0;
  qclab::qgates::SWAP<std::complex<double>_>::apply
            ((SWAP<std::complex<double>_> *)local_330,Left,NoTrans,2,
             (SquareMatrix<std::complex<double>_> *)local_2e0,0);
  pdVar17 = (double *)operator_new__(0x100);
  bVar35 = false;
  memset(pdVar17,0,0x100);
  *pdVar17 = 1.0;
  pdVar17[1] = 0.0;
  pdVar17[2] = 0.0;
  pdVar17[3] = 0.0;
  pdVar17[4] = 0.0;
  pdVar17[5] = 0.0;
  pdVar17[6] = 0.0;
  pdVar17[7] = 0.0;
  pdVar17[8] = 0.0;
  pdVar17[9] = 0.0;
  pdVar17[10] = 0.0;
  pdVar17[0xb] = 0.0;
  pdVar17[0xc] = 1.0;
  pdVar17[0xd] = 0.0;
  pdVar17[0xe] = 0.0;
  pdVar17[0xf] = 0.0;
  pdVar17[0x10] = 0.0;
  pdVar17[0x11] = 0.0;
  pdVar17[0x12] = 1.0;
  pdVar17[0x13] = 0.0;
  pdVar17[0x14] = 0.0;
  pdVar17[0x15] = 0.0;
  pdVar17[0x16] = 0.0;
  pdVar17[0x17] = 0.0;
  pdVar17[0x18] = 0.0;
  pdVar17[0x19] = 0.0;
  pdVar17[0x1a] = 0.0;
  pdVar17[0x1b] = 0.0;
  pdVar17[0x1c] = 0.0;
  pdVar17[0x1d] = 0.0;
  pdVar17[0x1e] = 1.0;
  pdVar17[0x1f] = 0.0;
  if (local_2e0 == (undefined1  [8])&DAT_00000004) {
    bVar35 = false;
    if ((*pdVar17 == *(double *)local_2d8._M_head_impl) &&
       (!NAN(*pdVar17) && !NAN(*(double *)local_2d8._M_head_impl))) {
      if ((pdVar17[1] == *(double *)((long)local_2d8._M_head_impl + 8)) &&
         (!NAN(pdVar17[1]) && !NAN(*(double *)((long)local_2d8._M_head_impl + 8)))) {
        lVar21 = 0;
        bVar35 = false;
        _Var25._M_head_impl = (complex<double> *)local_2d8;
        pdVar20 = pdVar17;
        do {
          lVar30 = 0x18;
          lVar31 = 0;
          while( true ) {
            if (lVar31 == 3) goto LAB_0036e69f;
            dVar5 = *(double *)((long)pdVar20 + lVar30 + -8);
            lVar31 = lVar31 + 1;
            pdVar2 = (double *)
                     ((long)((_Alloc_hider *)(_Var25._M_head_impl)->_M_value + -1) + lVar30);
            if ((dVar5 != *pdVar2) || (NAN(dVar5) || NAN(*pdVar2))) break;
            pdVar2 = (double *)((long)pdVar20 + lVar30);
            pdVar3 = (double *)
                     ((long)&((_Alloc_hider *)(_Var25._M_head_impl)->_M_value)->_M_p + lVar30);
            lVar30 = lVar30 + 0x10;
            if ((*pdVar2 != *pdVar3) || (NAN(*pdVar2) || NAN(*pdVar3))) break;
          }
          if (lVar31 < 4) break;
LAB_0036e69f:
          lVar21 = lVar21 + 1;
          bVar35 = 3 < lVar21;
          if (lVar21 == 4) break;
          pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)local_2d8._M_head_impl + lVar21 * 0x40);
          if ((pdVar17[lVar21 * 8] != (double)(pbVar4->_M_dataplus)._M_p) ||
             (NAN(pdVar17[lVar21 * 8]) || NAN((double)(pbVar4->_M_dataplus)._M_p))) break;
          pdVar20 = pdVar20 + 8;
          _Var25._M_head_impl = _Var25._M_head_impl + 4;
          if ((pdVar17[lVar21 * 8 + 1] !=
               (double)((size_type *)((long)local_2d8._M_head_impl + 8))[lVar21 * 8]) ||
             (NAN(pdVar17[lVar21 * 8 + 1]) ||
              NAN((double)((size_type *)((long)local_2d8._M_head_impl + 8))[lVar21 * 8]))) break;
        } while( true );
      }
    }
  }
  local_2c8[0] = (allocator_type)bVar35;
  local_2c0._M_elems[0] = 0;
  local_2c0._M_elems[1] = 0;
  operator_delete__(pdVar17);
  if (local_2c8[0] == (allocator_type)0x0) {
    testing::Message::Message((Message *)local_310);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_268,(internal *)local_2c8,(AssertionResult *)"mat2 == swap.matrix()",
               "false","true",(char *)pdVar20);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_2f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0xbb,(char *)local_268);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_2f8,(Message *)local_310);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2f8);
    if (local_268 != (undefined1  [8])&local_258) {
      operator_delete((void *)local_268,(ulong)(local_258._M_allocated_capacity + 1));
    }
    if (local_310 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_310 + 8))();
    }
  }
  if (local_2c0._M_elems != (_Type)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_2c0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_2c0._M_elems);
  }
  local_2c8 = (undefined1  [8])&DAT_00000004;
  aiVar18 = (_Type)operator_new__(0x100);
  memset((void *)aiVar18,0,0x100);
  *(undefined8 *)aiVar18 = 0x3ff0000000000000;
  *(undefined8 *)((long)aiVar18 + 8) = 0;
  *(undefined1 **)((long)aiVar18 + 0x10) = &DAT_4014000000000000;
  *(undefined8 *)((long)aiVar18 + 0x18) = 0;
  *(undefined1 **)((long)aiVar18 + 0x20) = &DAT_4022000000000000;
  *(undefined8 *)((long)aiVar18 + 0x28) = 0;
  *(undefined1 **)((long)aiVar18 + 0x30) = &DAT_402a000000000000;
  *(undefined8 *)((long)aiVar18 + 0x38) = 0;
  *(undefined8 *)((long)aiVar18 + 0x40) = 0x4000000000000000;
  *(undefined8 *)((long)aiVar18 + 0x48) = 0;
  *(undefined1 **)((long)aiVar18 + 0x50) = &DAT_4018000000000000;
  *(undefined8 *)((long)aiVar18 + 0x58) = 0;
  *(undefined1 **)((long)aiVar18 + 0x60) = &DAT_4024000000000000;
  *(undefined8 *)((long)aiVar18 + 0x68) = 0;
  *(undefined1 **)((long)aiVar18 + 0x70) = &DAT_402c000000000000;
  *(undefined8 *)((long)aiVar18 + 0x78) = 0;
  *(undefined1 **)((long)aiVar18 + 0x80) = &DAT_4008000000000000;
  *(undefined8 *)((long)aiVar18 + 0x88) = 0;
  *(undefined1 **)((long)aiVar18 + 0x90) = &DAT_401c000000000000;
  *(undefined8 *)((long)aiVar18 + 0x98) = 0;
  *(undefined1 **)((long)aiVar18 + 0xa0) = &DAT_4026000000000000;
  *(undefined8 *)((long)aiVar18 + 0xa8) = 0;
  *(undefined1 **)((long)aiVar18 + 0xb0) = &DAT_402e000000000000;
  *(undefined8 *)((long)aiVar18 + 0xb8) = 0;
  *(undefined1 **)((long)aiVar18 + 0xc0) = &DAT_4010000000000000;
  *(undefined8 *)((long)aiVar18 + 200) = 0;
  *(undefined1 **)((long)aiVar18 + 0xd0) = &DAT_4020000000000000;
  *(undefined8 *)((long)aiVar18 + 0xd8) = 0;
  *(undefined1 **)((long)aiVar18 + 0xe0) = &DAT_4028000000000000;
  *(undefined8 *)((long)aiVar18 + 0xe8) = 0;
  *(undefined1 **)((long)aiVar18 + 0xf0) = &DAT_4030000000000000;
  *(undefined8 *)((long)aiVar18 + 0xf8) = 0;
  local_2c0._M_elems = aiVar18;
  qclab::dense::SquareMatrix<std::complex<double>_>::operator=
            ((SquareMatrix<std::complex<double>_> *)local_2e0,
             (SquareMatrix<std::complex<double>_> *)local_2c8);
  pcVar29 = (char *)0x0;
  qclab::qgates::SWAP<std::complex<double>_>::apply
            ((SWAP<std::complex<double>_> *)local_330,Left,NoTrans,2,
             (SquareMatrix<std::complex<double>_> *)local_2e0,0);
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            (&local_c8,(SquareMatrix<std::complex<double>_> *)local_2c8);
  local_2f8 = (undefined1  [8])&DAT_00000004;
  pcVar19 = (pointer)operator_new__(0x100);
  memset(pcVar19,0,0x100);
  *(undefined8 *)pcVar19->_M_value = 0x3ff0000000000000;
  *(undefined8 *)(pcVar19[5]._M_value + 8) = 0;
  *(undefined8 *)(pcVar19[4]._M_value + 8) = 0;
  *(undefined8 *)pcVar19[5]._M_value = 0;
  *(undefined8 *)(pcVar19[3]._M_value + 8) = 0;
  *(undefined8 *)pcVar19[4]._M_value = 0;
  *(undefined8 *)(pcVar19[2]._M_value + 8) = 0;
  *(undefined8 *)pcVar19[3]._M_value = 0;
  *(undefined8 *)(pcVar19[1]._M_value + 8) = 0;
  *(undefined8 *)pcVar19[2]._M_value = 0;
  *(undefined8 *)((long)pcVar19->_M_value + 8) = 0;
  *(undefined8 *)pcVar19[1]._M_value = 0;
  *(undefined8 *)pcVar19[6]._M_value = 0x3ff0000000000000;
  *(undefined8 *)(pcVar19[8]._M_value + 8) = 0;
  *(undefined8 *)(pcVar19[7]._M_value + 8) = 0;
  *(undefined8 *)pcVar19[8]._M_value = 0;
  *(undefined8 *)(pcVar19[6]._M_value + 8) = 0;
  *(undefined8 *)pcVar19[7]._M_value = 0;
  *(undefined8 *)pcVar19[9]._M_value = 0x3ff0000000000000;
  *(undefined8 *)(pcVar19[0xe]._M_value + 8) = 0;
  *(undefined8 *)(pcVar19[0xd]._M_value + 8) = 0;
  *(undefined8 *)pcVar19[0xe]._M_value = 0;
  *(undefined8 *)(pcVar19[0xc]._M_value + 8) = 0;
  *(undefined8 *)pcVar19[0xd]._M_value = 0;
  *(undefined8 *)(pcVar19[0xb]._M_value + 8) = 0;
  *(undefined8 *)pcVar19[0xc]._M_value = 0;
  *(undefined8 *)(pcVar19[10]._M_value + 8) = 0;
  *(undefined8 *)pcVar19[0xb]._M_value = 0;
  *(undefined8 *)(pcVar19[9]._M_value + 8) = 0;
  *(undefined8 *)pcVar19[10]._M_value = 0;
  *(undefined8 *)pcVar19[0xf]._M_value = 0x3ff0000000000000;
  *(undefined8 *)(pcVar19[0xf]._M_value + 8) = 0;
  local_2f0._M_head_impl = pcVar19;
  qclab::dense::SquareMatrix<std::complex<double>_>::operator*=
            (&local_c8,(SquareMatrix<std::complex<double>_> *)local_2f8);
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)local_268,&local_c8);
  if (local_268 == local_2e0) {
    bVar35 = (long)local_2e0 < 1;
    if (0 < (long)local_2e0) {
      bVar35 = false;
      if ((*(double *)_Stack_260._M_head_impl == *(double *)local_2d8._M_head_impl) &&
         (!NAN(*(double *)_Stack_260._M_head_impl) && !NAN(*(double *)local_2d8._M_head_impl))) {
        if ((*(double *)((long)_Stack_260._M_head_impl + 8) ==
             *(double *)((long)local_2d8._M_head_impl + 8)) &&
           (!NAN(*(double *)((long)_Stack_260._M_head_impl + 8)) &&
            !NAN(*(double *)((long)local_2d8._M_head_impl + 8)))) {
          pcVar29 = (char *)((long)local_2e0 * 0x10);
          lVar21 = 0;
          bVar35 = false;
          _Var25._M_head_impl = (complex<double> *)local_2d8;
          _Var34._M_head_impl = (complex<double> *)_Stack_260;
          do {
            lVar30 = 0x18;
            pbVar32 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
            ;
            while( true ) {
              if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  ((long)local_2e0 + -1) == pbVar32) goto LAB_0036eb08;
              dVar5 = *(double *)((long)(_Var34._M_head_impl)->_M_value + lVar30 + -8);
              pbVar32 = pbVar32 + 1;
              pdVar20 = (double *)
                        ((long)((_Alloc_hider *)(_Var25._M_head_impl)->_M_value + -1) + lVar30);
              if ((dVar5 != *pdVar20) || (NAN(dVar5) || NAN(*pdVar20))) break;
              dVar5 = *(double *)((long)(_Var34._M_head_impl)->_M_value + lVar30);
              pdVar20 = (double *)
                        ((long)&((_Alloc_hider *)(_Var25._M_head_impl)->_M_value)->_M_p + lVar30);
              lVar30 = lVar30 + 0x10;
              if ((dVar5 != *pdVar20) || (NAN(dVar5) || NAN(*pdVar20))) break;
            }
            if ((long)pbVar32 < (long)local_2e0) break;
LAB_0036eb08:
            lVar21 = lVar21 + 1;
            bVar35 = (long)local_2e0 <= lVar21;
            if ((undefined1  [8])lVar21 == local_2e0) break;
            dVar5 = *(double *)
                     ((complex<double> *)
                     ((long)_Stack_260._M_head_impl + lVar21 * (long)local_268 * 0x10))->_M_value;
            pdVar20 = (double *)((long)local_2d8._M_head_impl + lVar21 * (long)local_2e0 * 0x10);
            if ((dVar5 != *pdVar20) || (NAN(dVar5) || NAN(*pdVar20))) break;
            _Var34._M_head_impl = _Var34._M_head_impl + (long)local_268;
            _Var25._M_head_impl = _Var25._M_head_impl + (long)local_2e0;
            if ((((double *)((long)_Stack_260._M_head_impl + 8))[lVar21 * (long)local_268 * 2] !=
                 (double)((size_type *)((long)local_2d8._M_head_impl + 8))
                         [lVar21 * (long)local_2e0 * 2]) ||
               (NAN(((double *)((long)_Stack_260._M_head_impl + 8))[lVar21 * (long)local_268 * 2])
                || NAN((double)((size_type *)((long)local_2d8._M_head_impl + 8))
                               [lVar21 * (long)local_2e0 * 2]))) break;
          } while( true );
        }
      }
    }
  }
  else {
    bVar35 = false;
  }
  local_310[0] = (internal)bVar35;
  local_308._M_head_impl = (complex<double> *)0x0;
  if ((_Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>)
      _Stack_260._M_head_impl != (complex<double> *)0x0) {
    operator_delete__(_Stack_260._M_head_impl);
  }
  _Stack_260._M_head_impl = (complex<double> *)0x0;
  if ((_Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>)
      local_2f0._M_head_impl != (complex<double> *)0x0) {
    operator_delete__(local_2f0._M_head_impl);
  }
  if ((_Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>)
      local_c8.data_._M_t.
      super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>._M_t
      .super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
      super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl != (complex<double> *)0x0) {
    operator_delete__((void *)local_c8.data_._M_t.
                              super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                              .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl);
  }
  local_c8.data_._M_t.
  super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>._M_t.
  super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
  super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
       (__uniq_ptr_data<std::complex<double>,_std::default_delete<std::complex<double>[]>,_true,_true>
        )(__uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>)0x0;
  if (local_310[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_2f8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_268,(internal *)local_310,
               (AssertionResult *)"mat2 == mat * swap.matrix()","false","true",pcVar29);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0xc4,(char *)local_268);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2b0,(Message *)local_2f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2b0);
    if (local_268 != (undefined1  [8])&local_258) {
      operator_delete((void *)local_268,(ulong)(local_258._M_allocated_capacity + 1));
    }
    if (local_2f8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_2f8 + 8))();
    }
  }
  if (local_308._M_head_impl != (complex<double> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_308,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_308._M_head_impl);
  }
  qclab::dense::SquareMatrix<std::complex<double>_>::operator=
            ((SquareMatrix<std::complex<double>_> *)local_2e0,
             (SquareMatrix<std::complex<double>_> *)local_2c8);
  pcVar29 = (char *)0x0;
  qclab::qgates::SWAP<std::complex<double>_>::apply
            ((SWAP<std::complex<double>_> *)local_330,Right,NoTrans,2,
             (SquareMatrix<std::complex<double>_> *)local_2e0,0);
  local_d8.size_ = 4;
  __s = (complex<double> *)operator_new__(0x100);
  memset(__s,0,0x100);
  *(undefined8 *)__s->_M_value = 0x3ff0000000000000;
  *(undefined8 *)(__s[5]._M_value + 8) = 0;
  *(undefined8 *)(__s[4]._M_value + 8) = 0;
  *(undefined8 *)__s[5]._M_value = 0;
  *(undefined8 *)(__s[3]._M_value + 8) = 0;
  *(undefined8 *)__s[4]._M_value = 0;
  *(undefined8 *)(__s[2]._M_value + 8) = 0;
  *(undefined8 *)__s[3]._M_value = 0;
  *(undefined8 *)(__s[1]._M_value + 8) = 0;
  *(undefined8 *)__s[2]._M_value = 0;
  *(undefined8 *)((long)__s->_M_value + 8) = 0;
  *(undefined8 *)__s[1]._M_value = 0;
  *(undefined8 *)__s[6]._M_value = 0x3ff0000000000000;
  *(undefined8 *)(__s[8]._M_value + 8) = 0;
  *(undefined8 *)(__s[7]._M_value + 8) = 0;
  *(undefined8 *)__s[8]._M_value = 0;
  *(undefined8 *)(__s[6]._M_value + 8) = 0;
  *(undefined8 *)__s[7]._M_value = 0;
  *(undefined8 *)__s[9]._M_value = 0x3ff0000000000000;
  *(undefined8 *)(__s[0xe]._M_value + 8) = 0;
  *(undefined8 *)(__s[0xd]._M_value + 8) = 0;
  *(undefined8 *)__s[0xe]._M_value = 0;
  *(undefined8 *)(__s[0xc]._M_value + 8) = 0;
  *(undefined8 *)__s[0xd]._M_value = 0;
  *(undefined8 *)(__s[0xb]._M_value + 8) = 0;
  *(undefined8 *)__s[0xc]._M_value = 0;
  *(undefined8 *)(__s[10]._M_value + 8) = 0;
  *(undefined8 *)__s[0xb]._M_value = 0;
  *(undefined8 *)(__s[9]._M_value + 8) = 0;
  *(undefined8 *)__s[10]._M_value = 0;
  *(undefined8 *)__s[0xf]._M_value = 0x3ff0000000000000;
  *(undefined8 *)(__s[0xf]._M_value + 8) = 0;
  local_d8.data_._M_t.
  super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>._M_t.
  super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
  super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
       (__uniq_ptr_data<std::complex<double>,_std::default_delete<std::complex<double>[]>,_true,_true>
        )(__uniq_ptr_data<std::complex<double>,_std::default_delete<std::complex<double>[]>,_true,_true>
          )__s;
  qclab::dense::SquareMatrix<std::complex<double>_>::operator*=
            (&local_d8,(SquareMatrix<std::complex<double>_> *)local_2c8);
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)local_268,&local_d8);
  if (local_268 == local_2e0) {
    bVar35 = (long)local_2e0 < 1;
    if (0 < (long)local_2e0) {
      bVar35 = false;
      if ((*(double *)_Stack_260._M_head_impl == *(double *)local_2d8._M_head_impl) &&
         (!NAN(*(double *)_Stack_260._M_head_impl) && !NAN(*(double *)local_2d8._M_head_impl))) {
        if ((*(double *)((long)_Stack_260._M_head_impl + 8) ==
             *(double *)((long)local_2d8._M_head_impl + 8)) &&
           (!NAN(*(double *)((long)_Stack_260._M_head_impl + 8)) &&
            !NAN(*(double *)((long)local_2d8._M_head_impl + 8)))) {
          pcVar29 = (char *)((long)local_2e0 * 0x10);
          lVar21 = 0;
          bVar35 = false;
          _Var25._M_head_impl = (complex<double> *)local_2d8;
          _Var34._M_head_impl = (complex<double> *)_Stack_260;
          do {
            lVar30 = 0x18;
            puVar33 = (undefined1 *)0x0;
            while( true ) {
              if ((undefined1 *)
                  ((long)&(((AssertHelperData *)((long)local_2e0 + -0x38))->message).field_2 + 0xf)
                  == puVar33) goto LAB_0036ee43;
              dVar5 = *(double *)((long)(_Var34._M_head_impl)->_M_value + lVar30 + -8);
              puVar33 = puVar33 + 1;
              pdVar20 = (double *)
                        ((long)((_Alloc_hider *)(_Var25._M_head_impl)->_M_value + -1) + lVar30);
              if ((dVar5 != *pdVar20) || (NAN(dVar5) || NAN(*pdVar20))) break;
              dVar5 = *(double *)((long)(_Var34._M_head_impl)->_M_value + lVar30);
              pdVar20 = (double *)
                        ((long)&((_Alloc_hider *)(_Var25._M_head_impl)->_M_value)->_M_p + lVar30);
              lVar30 = lVar30 + 0x10;
              if ((dVar5 != *pdVar20) || (NAN(dVar5) || NAN(*pdVar20))) break;
            }
            if ((long)puVar33 < (long)local_2e0) break;
LAB_0036ee43:
            lVar21 = lVar21 + 1;
            bVar35 = (long)local_2e0 <= lVar21;
            if ((undefined1  [8])lVar21 == local_2e0) break;
            dVar5 = *(double *)
                     ((complex<double> *)
                     ((long)_Stack_260._M_head_impl + lVar21 * (long)local_268 * 0x10))->_M_value;
            pdVar20 = (double *)((long)local_2d8._M_head_impl + lVar21 * (long)local_2e0 * 0x10);
            if ((dVar5 != *pdVar20) || (NAN(dVar5) || NAN(*pdVar20))) break;
            _Var34._M_head_impl = _Var34._M_head_impl + (long)local_268;
            _Var25._M_head_impl = _Var25._M_head_impl + (long)local_2e0;
            if ((((double *)((long)_Stack_260._M_head_impl + 8))[lVar21 * (long)local_268 * 2] !=
                 (double)((size_type *)((long)local_2d8._M_head_impl + 8))
                         [lVar21 * (long)local_2e0 * 2]) ||
               (NAN(((double *)((long)_Stack_260._M_head_impl + 8))[lVar21 * (long)local_268 * 2])
                || NAN((double)((size_type *)((long)local_2d8._M_head_impl + 8))
                               [lVar21 * (long)local_2e0 * 2]))) break;
          } while( true );
        }
      }
    }
  }
  else {
    bVar35 = false;
  }
  local_310[0] = (internal)bVar35;
  local_308._M_head_impl = (complex<double> *)0x0;
  if (_Stack_260._M_head_impl != (complex<double> *)0x0) {
    operator_delete__(_Stack_260._M_head_impl);
  }
  _Stack_260._M_head_impl = (complex<double> *)0x0;
  if ((_Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>)
      local_d8.data_._M_t.
      super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>._M_t
      .super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
      super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl != (complex<double> *)0x0) {
    operator_delete__((void *)local_d8.data_._M_t.
                              super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                              .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl);
  }
  local_d8.data_._M_t.
  super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>._M_t.
  super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
  super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
       (__uniq_ptr_data<std::complex<double>,_std::default_delete<std::complex<double>[]>,_true,_true>
        )(__uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>)0x0;
  if (local_310[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_2f8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_268,(internal *)local_310,
               (AssertionResult *)"mat2 == swap.matrix() * mat","false","true",pcVar29);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,200,(char *)local_268);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2b0,(Message *)local_2f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2b0);
    if (local_268 != (undefined1  [8])&local_258) {
      operator_delete((void *)local_268,(ulong)(local_258._M_allocated_capacity + 1));
    }
    if (local_2f8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_2f8 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_308._M_head_impl !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_308,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_308._M_head_impl);
  }
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)local_310,&local_b8);
  pcVar29 = (char *)0x0;
  qclab::qgates::SWAP<std::complex<double>_>::apply
            ((SWAP<std::complex<double>_> *)local_330,Left,NoTrans,3,
             (SquareMatrix<std::complex<double>_> *)local_310,0);
  local_2b0.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x4;
  pcVar19 = (pointer)operator_new__(0x100);
  memset(pcVar19,0,0x100);
  *(undefined8 *)pcVar19->_M_value = 0x3ff0000000000000;
  *(undefined8 *)(pcVar19[5]._M_value + 8) = 0;
  *(undefined8 *)(pcVar19[4]._M_value + 8) = 0;
  *(undefined8 *)pcVar19[5]._M_value = 0;
  *(undefined8 *)(pcVar19[3]._M_value + 8) = 0;
  *(undefined8 *)pcVar19[4]._M_value = 0;
  *(undefined8 *)(pcVar19[2]._M_value + 8) = 0;
  *(undefined8 *)pcVar19[3]._M_value = 0;
  *(undefined8 *)(pcVar19[1]._M_value + 8) = 0;
  *(undefined8 *)pcVar19[2]._M_value = 0;
  *(undefined8 *)((long)pcVar19->_M_value + 8) = 0;
  *(undefined8 *)pcVar19[1]._M_value = 0;
  *(undefined8 *)pcVar19[6]._M_value = 0x3ff0000000000000;
  *(undefined8 *)(pcVar19[8]._M_value + 8) = 0;
  *(undefined8 *)(pcVar19[7]._M_value + 8) = 0;
  *(undefined8 *)pcVar19[8]._M_value = 0;
  *(undefined8 *)(pcVar19[6]._M_value + 8) = 0;
  *(undefined8 *)pcVar19[7]._M_value = 0;
  *(undefined8 *)pcVar19[9]._M_value = 0x3ff0000000000000;
  *(undefined8 *)(pcVar19[0xe]._M_value + 8) = 0;
  *(undefined8 *)(pcVar19[0xd]._M_value + 8) = 0;
  *(undefined8 *)pcVar19[0xe]._M_value = 0;
  *(undefined8 *)(pcVar19[0xc]._M_value + 8) = 0;
  *(undefined8 *)pcVar19[0xd]._M_value = 0;
  *(undefined8 *)(pcVar19[0xb]._M_value + 8) = 0;
  *(undefined8 *)pcVar19[0xc]._M_value = 0;
  *(undefined8 *)(pcVar19[10]._M_value + 8) = 0;
  *(undefined8 *)pcVar19[0xb]._M_value = 0;
  *(undefined8 *)(pcVar19[9]._M_value + 8) = 0;
  *(undefined8 *)pcVar19[10]._M_value = 0;
  *(undefined8 *)pcVar19[0xf]._M_value = 0x3ff0000000000000;
  *(undefined8 *)(pcVar19[0xf]._M_value + 8) = 0;
  local_2b0.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl
  .super__Vector_impl_data._M_finish = pcVar19;
  qclab::dense::kron<std::complex<double>>
            ((dense *)local_268,(SquareMatrix<std::complex<double>_> *)&local_2b0,&local_68);
  if (local_268 == local_310) {
    bVar35 = (long)local_310 < 1;
    if (0 < (long)local_310) {
      bVar35 = false;
      if ((*(double *)_Stack_260._M_head_impl ==
           (double)((_Alloc_hider *)(local_308._M_head_impl)->_M_value)->_M_p) &&
         (!NAN(*(double *)_Stack_260._M_head_impl) &&
          !NAN((double)((_Alloc_hider *)(local_308._M_head_impl)->_M_value)->_M_p))) {
        if ((*(double *)((long)_Stack_260._M_head_impl + 8) ==
             *(double *)((_Alloc_hider *)(local_308._M_head_impl)->_M_value + 1)) &&
           (!NAN(*(double *)((long)_Stack_260._M_head_impl + 8)) &&
            !NAN(*(double *)((_Alloc_hider *)(local_308._M_head_impl)->_M_value + 1)))) {
          pcVar29 = (char *)((long)local_310 * 0x10);
          lVar21 = 0;
          bVar35 = false;
          _Var25._M_head_impl = local_308._M_head_impl;
          _Var34._M_head_impl = (complex<double> *)_Stack_260;
          do {
            lVar30 = 0x18;
            puVar33 = (undefined1 *)0x0;
            while( true ) {
              if ((undefined1 *)
                  ((long)&(((AssertHelperData *)((long)local_310 + -0x38))->message).field_2 + 0xf)
                  == puVar33) goto LAB_0036f168;
              dVar5 = *(double *)((long)(_Var34._M_head_impl)->_M_value + lVar30 + -8);
              puVar33 = puVar33 + 1;
              pdVar20 = (double *)((long)_Var25._M_head_impl + lVar30 + -8);
              if ((dVar5 != *pdVar20) || (NAN(dVar5) || NAN(*pdVar20))) break;
              dVar5 = *(double *)((long)(_Var34._M_head_impl)->_M_value + lVar30);
              pdVar20 = (double *)
                        ((long)&(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)_Var25._M_head_impl)->_M_dataplus)._M_p + lVar30);
              lVar30 = lVar30 + 0x10;
              if ((dVar5 != *pdVar20) || (NAN(dVar5) || NAN(*pdVar20))) break;
            }
            if ((long)puVar33 < (long)local_310) break;
LAB_0036f168:
            lVar21 = lVar21 + 1;
            bVar35 = (long)local_310 <= lVar21;
            if ((undefined1  [8])lVar21 == local_310) break;
            dVar5 = *(double *)
                     ((complex<double> *)
                     ((long)_Stack_260._M_head_impl + lVar21 * (long)local_268 * 0x10))->_M_value;
            if ((dVar5 != *(double *)local_308._M_head_impl[lVar21 * (long)local_310]._M_value) ||
               (NAN(dVar5) ||
                NAN(*(double *)local_308._M_head_impl[lVar21 * (long)local_310]._M_value))) break;
            _Var34._M_head_impl = _Var34._M_head_impl + (long)local_268;
            _Var25._M_head_impl =
                 (complex<double> *)
                 (pcVar29 +
                 (long)&((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        _Var25._M_head_impl)->_M_dataplus);
            if ((((double *)((long)_Stack_260._M_head_impl + 8))[lVar21 * (long)local_268 * 2] !=
                 *(double *)((long)local_308._M_head_impl[lVar21 * (long)local_310]._M_value + 8))
               || (NAN(((double *)((long)_Stack_260._M_head_impl + 8))[lVar21 * (long)local_268 * 2]
                      ) || NAN(*(double *)
                                ((long)local_308._M_head_impl[lVar21 * (long)local_310]._M_value + 8
                                )))) break;
          } while( true );
        }
      }
    }
  }
  else {
    bVar35 = false;
  }
  local_2f8[0] = (allocator_type)bVar35;
  local_2f0._M_head_impl = (complex<double> *)0x0;
  if ((_Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>)
      _Stack_260._M_head_impl != (complex<double> *)0x0) {
    operator_delete__(_Stack_260._M_head_impl);
  }
  _Stack_260._M_head_impl = (complex<double> *)0x0;
  if (local_2b0.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
      _M_impl.super__Vector_impl_data._M_finish != (complex<double> *)0x0) {
    operator_delete__(local_2b0.
                      super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish);
  }
  if (local_2f8[0] == (allocator_type)0x0) {
    testing::Message::Message((Message *)&local_2b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_268,(internal *)local_2f8,
               (AssertionResult *)"mat3 == qclab::dense::kron( swap.matrix() , I1 )","false","true",
               pcVar29);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_290,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0xcd,(char *)local_268);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_290,(Message *)&local_2b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_290);
    if (local_268 != (undefined1  [8])&local_258) {
      operator_delete((void *)local_268,(ulong)(local_258._M_allocated_capacity + 1));
    }
    if (local_2b0.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*(long *)(local_2b0.
                             super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->_M_value + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2f0._M_head_impl !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_2f0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_2f0._M_head_impl);
  }
  local_328._M_elems[0] = 1;
  local_328._M_elems[1] = 2;
  qclab::dense::SquareMatrix<std::complex<double>_>::operator=
            ((SquareMatrix<std::complex<double>_> *)local_310,&local_b8);
  pcVar29 = (char *)0x0;
  qclab::qgates::SWAP<std::complex<double>_>::apply
            ((SWAP<std::complex<double>_> *)local_330,Left,NoTrans,3,
             (SquareMatrix<std::complex<double>_> *)local_310,0);
  local_2b0.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x4;
  pcVar19 = (pointer)operator_new__(0x100);
  memset(pcVar19,0,0x100);
  *(undefined8 *)pcVar19->_M_value = 0x3ff0000000000000;
  *(undefined8 *)(pcVar19[5]._M_value + 8) = 0;
  *(undefined8 *)(pcVar19[4]._M_value + 8) = 0;
  *(undefined8 *)pcVar19[5]._M_value = 0;
  *(undefined8 *)(pcVar19[3]._M_value + 8) = 0;
  *(undefined8 *)pcVar19[4]._M_value = 0;
  *(undefined8 *)(pcVar19[2]._M_value + 8) = 0;
  *(undefined8 *)pcVar19[3]._M_value = 0;
  *(undefined8 *)(pcVar19[1]._M_value + 8) = 0;
  *(undefined8 *)pcVar19[2]._M_value = 0;
  *(undefined8 *)((long)pcVar19->_M_value + 8) = 0;
  *(undefined8 *)pcVar19[1]._M_value = 0;
  *(undefined8 *)pcVar19[6]._M_value = 0x3ff0000000000000;
  *(undefined8 *)(pcVar19[8]._M_value + 8) = 0;
  *(undefined8 *)(pcVar19[7]._M_value + 8) = 0;
  *(undefined8 *)pcVar19[8]._M_value = 0;
  *(undefined8 *)(pcVar19[6]._M_value + 8) = 0;
  *(undefined8 *)pcVar19[7]._M_value = 0;
  *(undefined8 *)pcVar19[9]._M_value = 0x3ff0000000000000;
  *(undefined8 *)(pcVar19[0xe]._M_value + 8) = 0;
  *(undefined8 *)(pcVar19[0xd]._M_value + 8) = 0;
  *(undefined8 *)pcVar19[0xe]._M_value = 0;
  *(undefined8 *)(pcVar19[0xc]._M_value + 8) = 0;
  *(undefined8 *)pcVar19[0xd]._M_value = 0;
  *(undefined8 *)(pcVar19[0xb]._M_value + 8) = 0;
  *(undefined8 *)pcVar19[0xc]._M_value = 0;
  *(undefined8 *)(pcVar19[10]._M_value + 8) = 0;
  *(undefined8 *)pcVar19[0xb]._M_value = 0;
  *(undefined8 *)(pcVar19[9]._M_value + 8) = 0;
  *(undefined8 *)pcVar19[10]._M_value = 0;
  *(undefined8 *)pcVar19[0xf]._M_value = 0x3ff0000000000000;
  *(undefined8 *)(pcVar19[0xf]._M_value + 8) = 0;
  local_2b0.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl
  .super__Vector_impl_data._M_finish = pcVar19;
  qclab::dense::kron<std::complex<double>>
            ((dense *)local_268,&local_68,(SquareMatrix<std::complex<double>_> *)&local_2b0);
  if (local_268 == local_310) {
    bVar35 = (long)local_310 < 1;
    if (0 < (long)local_310) {
      bVar35 = false;
      if ((*(double *)_Stack_260._M_head_impl == *(double *)local_308._M_head_impl) &&
         (!NAN(*(double *)_Stack_260._M_head_impl) && !NAN(*(double *)local_308._M_head_impl))) {
        if ((*(double *)((long)_Stack_260._M_head_impl + 8) ==
             *(double *)((long)local_308._M_head_impl + 8)) &&
           (!NAN(*(double *)((long)_Stack_260._M_head_impl + 8)) &&
            !NAN(*(double *)((long)local_308._M_head_impl + 8)))) {
          pcVar29 = (char *)((long)local_310 * 0x10);
          lVar21 = 0;
          bVar35 = false;
          _Var25._M_head_impl = (complex<double> *)local_308;
          _Var34._M_head_impl = (complex<double> *)_Stack_260;
          do {
            lVar30 = 0x18;
            pbVar32 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
            ;
            while( true ) {
              if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  ((long)local_310 + -1) == pbVar32) goto LAB_0036f499;
              dVar5 = *(double *)((long)(_Var34._M_head_impl)->_M_value + lVar30 + -8);
              pbVar32 = pbVar32 + 1;
              pdVar20 = (double *)
                        ((long)((_Alloc_hider *)(_Var25._M_head_impl)->_M_value + -1) + lVar30);
              if ((dVar5 != *pdVar20) || (NAN(dVar5) || NAN(*pdVar20))) break;
              dVar5 = *(double *)((long)(_Var34._M_head_impl)->_M_value + lVar30);
              pdVar20 = (double *)
                        ((long)&((_Alloc_hider *)(_Var25._M_head_impl)->_M_value)->_M_p + lVar30);
              lVar30 = lVar30 + 0x10;
              if ((dVar5 != *pdVar20) || (NAN(dVar5) || NAN(*pdVar20))) break;
            }
            if ((long)pbVar32 < (long)local_310) break;
LAB_0036f499:
            lVar21 = lVar21 + 1;
            bVar35 = (long)local_310 <= lVar21;
            if ((undefined1  [8])lVar21 == local_310) break;
            dVar5 = *(double *)
                     ((complex<double> *)
                     ((long)_Stack_260._M_head_impl + lVar21 * (long)local_268 * 0x10))->_M_value;
            pdVar20 = (double *)((long)local_308._M_head_impl + lVar21 * (long)local_310 * 0x10);
            if ((dVar5 != *pdVar20) || (NAN(dVar5) || NAN(*pdVar20))) break;
            _Var34._M_head_impl = _Var34._M_head_impl + (long)local_268;
            _Var25._M_head_impl = _Var25._M_head_impl + (long)local_310;
            if ((((double *)((long)_Stack_260._M_head_impl + 8))[lVar21 * (long)local_268 * 2] !=
                 (double)((size_type *)((long)local_308._M_head_impl + 8))
                         [lVar21 * (long)local_310 * 2]) ||
               (NAN(((double *)((long)_Stack_260._M_head_impl + 8))[lVar21 * (long)local_268 * 2])
                || NAN((double)((size_type *)((long)local_308._M_head_impl + 8))
                               [lVar21 * (long)local_310 * 2]))) break;
          } while( true );
        }
      }
    }
  }
  else {
    bVar35 = false;
  }
  local_2f8[0] = (allocator_type)bVar35;
  local_2f0._M_head_impl = (complex<double> *)0x0;
  if ((_Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>)
      _Stack_260._M_head_impl != (complex<double> *)0x0) {
    operator_delete__(_Stack_260._M_head_impl);
  }
  _Stack_260._M_head_impl = (complex<double> *)0x0;
  if (local_2b0.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
      _M_impl.super__Vector_impl_data._M_finish != (complex<double> *)0x0) {
    operator_delete__(local_2b0.
                      super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish);
  }
  if (local_2f8[0] == (allocator_type)0x0) {
    testing::Message::Message((Message *)&local_2b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_268,(internal *)local_2f8,
               (AssertionResult *)"mat3 == qclab::dense::kron( I1 , swap.matrix() )","false","true",
               pcVar29);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_290,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0xd3,(char *)local_268);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_290,(Message *)&local_2b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_290);
    if (local_268 != (undefined1  [8])&local_258) {
      operator_delete((void *)local_268,(ulong)(local_258._M_allocated_capacity + 1));
    }
    if (local_2b0.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*(long *)(local_2b0.
                             super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->_M_value + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2f0._M_head_impl !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_2f0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_2f0._M_head_impl);
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_308._M_head_impl !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete__(local_308._M_head_impl);
  }
  if (local_2c0._M_elems != (_Type)0x0) {
    operator_delete__((void *)local_2c0._M_elems);
  }
  if (local_2d8._M_head_impl != (complex<double> *)0x0) {
    operator_delete__(local_2d8._M_head_impl);
  }
  local_330 = (undefined1  [8])&PTR_nbQubits_00525a88;
  local_328._M_elems[0] = 0;
  local_328._M_elems[1] = 2;
  pdVar20 = (double *)operator_new__(0x400);
  memset(pdVar20,0,0x400);
  *pdVar20 = 1.0;
  pdVar20[1] = 0.0;
  pdVar20[0x18] = 1.0;
  pdVar20[0x19] = 0.0;
  pdVar20[0x24] = 1.0;
  pdVar20[0x25] = 0.0;
  pdVar20[0x3c] = 1.0;
  pdVar20[0x3d] = 0.0;
  pdVar20[0x42] = 1.0;
  pdVar20[0x43] = 0.0;
  pdVar20[0x5a] = 1.0;
  pdVar20[0x5b] = 0.0;
  pdVar20[0x66] = 1.0;
  pdVar20[0x67] = 0.0;
  pdVar20[0x7e] = 1.0;
  pdVar20[0x7f] = 0.0;
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)local_2e0,&local_b8);
  _Var25._M_head_impl = (complex<double> *)0x0;
  qclab::qgates::SWAP<std::complex<double>_>::apply
            ((SWAP<std::complex<double>_> *)local_330,Left,NoTrans,3,
             (SquareMatrix<std::complex<double>_> *)local_2e0,0);
  if (local_2e0 == (undefined1  [8])&DAT_00000008) {
    bVar26 = false;
    bVar35 = false;
    if ((*pdVar20 == (double)((_Alloc_hider *)(local_2d8._M_head_impl)->_M_value)->_M_p) &&
       (bVar35 = bVar26,
       !NAN(*pdVar20) && !NAN((double)((_Alloc_hider *)(local_2d8._M_head_impl)->_M_value)->_M_p)))
    {
      if ((pdVar20[1] == *(double *)((_Alloc_hider *)(local_2d8._M_head_impl)->_M_value + 1)) &&
         (!NAN(pdVar20[1]) &&
          !NAN(*(double *)((_Alloc_hider *)(local_2d8._M_head_impl)->_M_value + 1)))) {
        lVar21 = 0;
        bVar35 = false;
        _Var25._M_head_impl = local_2d8._M_head_impl;
        pdVar17 = pdVar20;
        do {
          lVar30 = 0x18;
          lVar31 = 0;
          while( true ) {
            if (lVar31 == 7) goto LAB_0036f78b;
            dVar5 = *(double *)((long)pdVar17 + lVar30 + -8);
            lVar31 = lVar31 + 1;
            pdVar2 = (double *)((long)_Var25._M_head_impl + lVar30 + -8);
            if ((dVar5 != *pdVar2) || (NAN(dVar5) || NAN(*pdVar2))) break;
            pdVar2 = (double *)((long)pdVar17 + lVar30);
            pdVar3 = (double *)
                     ((long)&(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              _Var25._M_head_impl)->_M_dataplus)._M_p + lVar30);
            lVar30 = lVar30 + 0x10;
            if ((*pdVar2 != *pdVar3) || (NAN(*pdVar2) || NAN(*pdVar3))) break;
          }
          if (lVar31 < 8) break;
LAB_0036f78b:
          lVar21 = lVar21 + 1;
          bVar35 = 7 < lVar21;
          if (lVar21 == 8) break;
          if ((pdVar20[lVar21 * 0x10] != *(double *)local_2d8._M_head_impl[lVar21 * 8]._M_value) ||
             (NAN(pdVar20[lVar21 * 0x10]) ||
              NAN(*(double *)local_2d8._M_head_impl[lVar21 * 8]._M_value))) break;
          pdVar17 = pdVar17 + 0x10;
          _Var25._M_head_impl = (complex<double> *)((long)_Var25._M_head_impl + 0x80);
          if ((pdVar20[lVar21 * 0x10 + 1] !=
               *(double *)((long)local_2d8._M_head_impl[lVar21 * 8]._M_value + 8)) ||
             (NAN(pdVar20[lVar21 * 0x10 + 1]) ||
              NAN(*(double *)((long)local_2d8._M_head_impl[lVar21 * 8]._M_value + 8)))) break;
        } while( true );
      }
    }
  }
  else {
    bVar35 = false;
  }
  local_2c8[0] = (allocator_type)bVar35;
  local_2c0._M_elems[0] = 0;
  local_2c0._M_elems[1] = 0;
  if (!bVar35) {
    testing::Message::Message((Message *)local_310);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_268,(internal *)local_2c8,(AssertionResult *)"mat3 == check","false",
               "true",(char *)_Var25._M_head_impl);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_2f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0xe6,(char *)local_268);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_2f8,(Message *)local_310);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2f8);
    if (local_268 != (undefined1  [8])&local_258) {
      operator_delete((void *)local_268,(ulong)(local_258._M_allocated_capacity + 1));
    }
    if (local_310 != (undefined1  [8])0x0) {
      (**(code **)((long)*(double *)local_310 + 8))();
    }
  }
  if (local_2c0._M_elems != (_Type)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_2c0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_2c0._M_elems);
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d8._M_head_impl !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete__(local_2d8._M_head_impl);
  }
  operator_delete__(pdVar20);
  if (local_a8.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8.
                    super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_a8.
                          super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a8.
                          super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_90.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_90.
                    super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_90.
                          super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_90.
                          super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_58.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.
                    super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_58.
                          super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.
                          super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_38 != (void *)0x0) {
    operator_delete__(local_38);
  }
  if (local_b8.data_._M_t.
      super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>._M_t
      .super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
      super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>)0x0) {
    operator_delete__((void *)local_b8.data_._M_t.
                              super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                              .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl);
  }
  if (local_78.data_._M_t.
      super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>._M_t
      .super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
      super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>)0x0) {
    operator_delete__((void *)local_78.data_._M_t.
                              super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                              .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl);
  }
  if ((tuple<std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>)
      local_68.data_._M_t.
      super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>._M_t
      .super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
      super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl !=
      (_Head_base<0UL,_std::complex<double>_*,_false>)0x0) {
    operator_delete__((void *)local_68.data_._M_t.
                              super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                              .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl);
  }
  return;
}

Assistant:

void test_qclab_qgates_SWAP() {

  const auto I1 = qclab::dense::eye< T >(  2 ) ;
  const auto I2 = qclab::dense::eye< T >(  4 ) ;
  const auto I3 = qclab::dense::eye< T >(  8 ) ;
  const auto I4 = qclab::dense::eye< T >( 16 ) ;

  using V = std::vector< T > ;
  const V v2 = { 3 , 5 , 2 , 7 } ;
  const V v3 = { 3 , 5 , 2 , 7 , 4 , 1 , 8 , 3 } ;
  const V v4 = { 3 , 5 , 2 , 7 , 4 , 1 , 8 , 3 , 7 , 2 , 5 , 6 , 8 , 9 , 5 , 1};

  {
    qclab::qgates::SWAP< T >  swap ;

    EXPECT_EQ( swap.nbQubits() , 2 ) ;   // nbQubits
    EXPECT_TRUE( swap.fixed() ) ;        // fixed
    EXPECT_FALSE( swap.controlled() ) ;  // controlled

    // qubit
    EXPECT_EQ( swap.qubit() , 0 ) ;

    // qubits
    auto qubits = swap.qubits() ;
    EXPECT_EQ( qubits.size() , 2 ) ;
    EXPECT_EQ( qubits[0] , 0 ) ;
    EXPECT_EQ( qubits[1] , 1 ) ;
    int qnew[] = { 3 , 5 } ;
    swap.setQubits( &qnew[0] ) ;
    EXPECT_EQ( swap.qubits()[0] , 3 ) ;
    EXPECT_EQ( swap.qubits()[1] , 5 ) ;
    qnew[0] = 0 ;
    qnew[1] = 1 ;
    swap.setQubits( &qnew[0] ) ;

    // matrix
    qclab::dense::SquareMatrix< T >  SWAP_check( 1 , 0 , 0 , 0 ,
                                                 0 , 0 , 1 , 0 ,
                                                 0 , 1 , 0 , 0 ,
                                                 0 , 0 , 0 , 1 ) ;
    EXPECT_TRUE( swap.matrix() == SWAP_check ) ;

    // print
    swap.print() ;

    // toQASM
    std::stringstream qasm ;
    EXPECT_EQ( swap.toQASM( qasm ) , 0 ) ;
    EXPECT_EQ( qasm.str() , "swap q[0], q[1];\n" ) ;
    std::cout << qasm.str() ;

    // operators == and !=
    qclab::qgates::SWAP< T >  swap2( 2 , 4 ) ;
    EXPECT_TRUE(  swap == swap2 ) ;
    EXPECT_FALSE( swap != swap2 ) ;
  }

  {
    qclab::qgates::SWAP< T >  swap( 3 , 5 ) ;

    EXPECT_EQ( swap.nbQubits() , 2 ) ;   // nbQubits
    EXPECT_TRUE( swap.fixed() ) ;        // fixed
    EXPECT_FALSE( swap.controlled() ) ;  // controlled
    EXPECT_EQ( swap.qubits()[0] , 3 ) ;  // qubit0
    EXPECT_EQ( swap.qubits()[1] , 5 ) ;  // qubit1
  }

  {
    int qubits[] = { 3 , 5 } ;
    qclab::qgates::SWAP< T >  swap( &qubits[0] ) ;

    EXPECT_EQ( swap.nbQubits() , 2 ) ;   // nbQubits
    EXPECT_TRUE( swap.fixed() ) ;        // fixed
    EXPECT_FALSE( swap.controlled() ) ;  // controlled
    EXPECT_EQ( swap.qubits()[0] , 3 ) ;  // qubit0
    EXPECT_EQ( swap.qubits()[1] , 5 ) ;  // qubit1
  }

  {
    qclab::qgates::SWAP< T >  swap( 0 , 1 ) ;

    // apply (2 qubits)
    auto vec2 = v2 ;
    swap.apply( qclab::Op::NoTrans , 2 , vec2 ) ;
    V check2 = { 3 , 2 , 5 , 7 } ;
    EXPECT_TRUE( vec2 == check2 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec2 = v2 ; T* vec2_ = vec2.data() ;
    #pragma omp target data map(tofrom:vec2_[0:4])
    { swap.apply_device( qclab::Op::NoTrans , 2 , vec2_ ) ; }
    EXPECT_TRUE( vec2 == check2 ) ;
  #endif

    // apply (3 qubits)
    auto vec3 = v3 ;
    swap.apply( qclab::Op::NoTrans , 3 , vec3 ) ;
    V check3 = { 3 , 5 , 4 , 1 , 2 , 7 , 8 , 3 } ;
    EXPECT_TRUE( vec3 == check3 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec3 = v3 ; T* vec3_ = vec3.data() ;
    #pragma omp target data map(tofrom:vec3_[0:8])
    { swap.apply_device( qclab::Op::NoTrans , 3 , vec3_ ) ; }
    EXPECT_TRUE( vec3 == check3 ) ;
  #endif

    int qnew[] = { 1 , 2 } ;
    swap.setQubits( &qnew[0] ) ;
    vec3 = v3 ;
    swap.apply( qclab::Op::NoTrans , 3 , vec3 ) ;
    check3 = { 3 , 2 , 5 , 7 , 4 , 8 , 1 , 3 } ;
    EXPECT_TRUE( vec3 == check3 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec3 = v3 ;
    #pragma omp target data map(tofrom:vec3_[0:8])
    { swap.apply_device( qclab::Op::NoTrans , 3 , vec3_ ) ; }
    EXPECT_TRUE( vec3 == check3 ) ;
  #endif

    // apply (4 qubits)
    auto vec4 = v4 ;
    swap.apply( qclab::Op::NoTrans , 4 , vec4 ) ;
    V check4 = { 3 , 5 , 4 , 1 , 2 , 7 , 8 , 3 , 7 , 2 , 8 , 9 , 5 , 6 , 5 , 1};
    EXPECT_TRUE( vec4 == check4 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec4 = v4 ; T* vec4_ = vec4.data() ;
    #pragma omp target data map(tofrom:vec4_[0:16])
    { swap.apply_device( qclab::Op::NoTrans , 4 , vec4_ ) ; }
    EXPECT_TRUE( vec4 == check4 ) ;
  #endif

    qnew[0] = 0 ;
    qnew[1] = 1 ;
    swap.setQubits( &qnew[0] ) ;
    vec4 = v4 ;
    swap.apply( qclab::Op::NoTrans , 4 , vec4 ) ;
    check4 = { 3 , 5 , 2 , 7 , 7 , 2 , 5 , 6 , 4 , 1 , 8 , 3 , 8 , 9 , 5 , 1 } ;
    EXPECT_TRUE( vec4 == check4 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec4 = v4 ;
    #pragma omp target data map(tofrom:vec4_[0:16])
    { swap.apply_device( qclab::Op::NoTrans , 4 , vec4_ ) ; }
    EXPECT_TRUE( vec4 == check4 ) ;
  #endif

    qnew[0] = 2 ;
    qnew[1] = 3 ;
    swap.setQubits( &qnew[0] ) ;
    vec4 = v4 ;
    swap.apply( qclab::Op::NoTrans , 4 , vec4 ) ;
    check4 = { 3 , 2 , 5 , 7 , 4 , 8 , 1 , 3 , 7 , 5 , 2 , 6 , 8 , 5 , 9 , 1 } ;
    EXPECT_TRUE( vec4 == check4 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec4 = v4 ;
    #pragma omp target data map(tofrom:vec4_[0:16])
    { swap.apply_device( qclab::Op::NoTrans , 4 , vec4_ ) ; }
    EXPECT_TRUE( vec4 == check4 ) ;
  #endif
  }

  {
    qclab::qgates::SWAP< T >  swap( 0 , 2 ) ;

    // apply (3 qubits)
    auto vec3 = v3 ;
    swap.apply( qclab::Op::NoTrans , 3 , vec3 ) ;
    V check3 = { 3 , 4 , 2 , 8 , 5 , 1 , 7 , 3 } ;
    EXPECT_TRUE( vec3 == check3 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec3 = v3 ; T* vec3_ = vec3.data() ;
    #pragma omp target data map(tofrom:vec3_[0:8])
    { swap.apply_device( qclab::Op::NoTrans , 3 , vec3_ ) ; }
    EXPECT_TRUE( vec3 == check3 ) ;
  #endif
  }

  {
    qclab::qgates::SWAP< T >  swap( 0 , 1 ) ;

    // apply (2 qubits)
    auto mat2 = I2 ;
    swap.apply( qclab::Side::Left , qclab::Op::NoTrans , 2 , mat2 ) ;
    EXPECT_TRUE( mat2 == swap.matrix() ) ;

    qclab::dense::SquareMatrix< T >  mat(  1 ,  2 ,  3 ,  4 ,
                                           5 ,  6 ,  7 ,  8 ,
                                           9 , 10 , 11 , 12 ,
                                          13 , 14 , 15 , 16 ) ;

    mat2 = mat ;
    swap.apply( qclab::Side::Left , qclab::Op::NoTrans , 2 , mat2 ) ;
    EXPECT_TRUE( mat2 == mat * swap.matrix() ) ;

    mat2 = mat ;
    swap.apply( qclab::Side::Right , qclab::Op::NoTrans , 2 , mat2 ) ;
    EXPECT_TRUE( mat2 == swap.matrix() * mat ) ;

    // apply (3 qubits)
    auto mat3 = I3 ;
    swap.apply( qclab::Side::Left , qclab::Op::NoTrans , 3 , mat3 ) ;
    EXPECT_TRUE( mat3 == qclab::dense::kron( swap.matrix() , I1 ) ) ;

    int qnew[] = { 1 , 2 } ;
    swap.setQubits( &qnew[0] ) ;
    mat3 = I3 ;
    swap.apply( qclab::Side::Left , qclab::Op::NoTrans , 3 , mat3 ) ;
    EXPECT_TRUE( mat3 == qclab::dense::kron( I1 , swap.matrix() ) ) ;
  }

  {
    qclab::qgates::SWAP< T >  swap( 0 , 2 ) ;

    auto check = qclab::dense::zeros< T >( 8 ) ;
    check(0,0) = 1 ;
    check(4,1) = 1 ;
    check(2,2) = 1 ;
    check(6,3) = 1 ;
    check(1,4) = 1 ;
    check(5,5) = 1 ;
    check(3,6) = 1 ;
    check(7,7) = 1 ;

    // apply (3 qubits)
    auto mat3 = I3 ;
    swap.apply( qclab::Side::Left , qclab::Op::NoTrans , 3 , mat3 ) ;
    EXPECT_TRUE( mat3 == check ) ;
  }

}